

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_fma::forward
          (Convolution1D_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  float *pfVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int *piVar18;
  undefined1 auVar19 [16];
  void *pvVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [32];
  uint uVar32;
  long lVar33;
  long lVar34;
  undefined4 *puVar35;
  _func_int ***ppp_Var36;
  uint uVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  void *pvVar42;
  void *pvVar43;
  _func_int ***ppp_Var44;
  int iVar45;
  uint uVar46;
  undefined1 (*pauVar47) [32];
  undefined1 (*pauVar48) [16];
  uint uVar49;
  undefined4 *puVar50;
  undefined1 (*pauVar51) [32];
  long lVar52;
  uint uVar53;
  long lVar54;
  float *pfVar55;
  int iVar56;
  long lVar57;
  uint uVar58;
  long lVar59;
  float *pfVar60;
  long lVar61;
  bool bVar62;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar64;
  float fVar65;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  float sum [4];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [28];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar119;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar121 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar192;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [64];
  __m128 one;
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [64];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  int elempack;
  int inh;
  ulong local_200;
  ulong local_1f0;
  long local_1d8;
  long local_1c8;
  undefined1 (*local_1c0) [32];
  void *local_1b0;
  ulong local_1a0;
  Allocator *local_198;
  Allocator *local_158;
  ulong local_148;
  ulong local_140;
  uint local_130;
  long local_128;
  undefined1 local_118 [16];
  Mat local_d8;
  undefined8 local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  void *local_48;
  void *local_40;
  long local_38;
  float fVar63;
  undefined1 auVar82 [32];
  float fVar86;
  
  uVar29 = bottom_blob->elemsize;
  iVar3 = (this->super_Convolution1D).kernel_w;
  iVar4 = (this->super_Convolution1D).dilation_w;
  iVar5 = bottom_blob->elempack;
  local_d8.cstep = 0;
  local_d8.data = (Allocator *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elempack = 0;
  local_d8.elemsize._4_4_ = (int)local_d8.refcount;
  local_d8.allocator = (Allocator *)local_d8.data;
  local_d8.dims = (int)local_d8.refcount;
  local_d8.w = local_d8.refcount._4_4_;
  local_d8.h = (int)local_d8.elemsize;
  local_d8.d = (int)local_d8.refcount;
  local_d8.c = local_d8.elempack;
  Convolution1D::make_padding(&this->super_Convolution1D,bottom_blob,&local_d8,opt);
  iVar45 = -100;
  if (((Allocator *)local_d8.data != (Allocator *)0x0) && ((long)local_d8.c * local_d8.cstep != 0))
  {
    lVar26 = 1;
    if (opt->use_packing_layout == true) {
      uVar32 = (this->super_Convolution1D).num_output;
      lVar26 = 8;
      if ((uVar32 & 7) != 0) {
        lVar26 = (ulong)((uVar32 & 3) == 0) * 3 + 1;
      }
    }
    Mat::create(top_blob,(local_d8.w + ~((iVar3 + -1) * iVar4)) /
                         (this->super_Convolution1D).stride_w + 1,
                (this->super_Convolution1D).num_output / (int)lVar26,
                lVar26 * (uVar29 / (ulong)(long)iVar5),(int)lVar26,opt->blob_allocator);
    iVar3 = local_d8.elempack;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar4 = (this->super_Convolution1D).kernel_w;
      uVar32 = (this->super_Convolution1D).activation_type;
      local_80 = (ulong)uVar32;
      iVar5 = (this->super_Convolution1D).dilation_w;
      lVar26 = (long)iVar5;
      iVar45 = (this->super_Convolution1D).stride_w;
      lVar27 = (long)iVar45;
      uVar21 = local_d8.h * local_d8.elempack;
      iVar22 = local_d8.w * local_d8.elempack;
      local_60 = (long)top_blob->w;
      local_88 = (long)top_blob->h * (long)top_blob->elempack;
      lVar54 = top_blob->elempack * local_60;
      iVar24 = (int)local_88;
      iVar25 = iVar24 + 7;
      if (-1 < iVar24) {
        iVar25 = iVar24;
      }
      pvVar6 = (this->super_Convolution1D).bias_data.data;
      uVar37 = iVar25 >> 3;
      lVar61 = (long)iVar22;
      iVar25 = (int)lVar54;
      if (7 < iVar24) {
        local_90 = (ulong)(iVar25 * 7);
        auVar206 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar203 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar209 = ZEXT1664(ZEXT816(0) << 0x40);
        local_78 = lVar61 * 4;
        local_1f0 = 0;
        auVar305._8_4_ = 0x3f318000;
        auVar305._0_8_ = 0x3f3180003f318000;
        auVar305._12_4_ = 0x3f318000;
        auVar305._16_4_ = 0x3f318000;
        auVar305._20_4_ = 0x3f318000;
        auVar305._24_4_ = 0x3f318000;
        auVar305._28_4_ = 0x3f318000;
        do {
          lVar28 = (long)top_blob->w;
          if (0 < lVar28) {
            uVar58 = local_d8.h * local_d8.elempack;
            iVar56 = top_blob->elempack;
            local_1c0 = (undefined1 (*) [32])
                        ((int)((long)((ulong)(uint)((int)(local_1f0 * 8) >> 0x1f) << 0x20 |
                                     local_1f0 * 8 & 0xffffffff) / (long)iVar56) * lVar28 *
                         top_blob->elemsize + (long)top_blob->data);
            local_1c8 = 0;
            iVar40 = 0;
            local_1d8 = 0;
            local_198 = (Allocator *)local_78;
            do {
              auVar300 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar85 = ZEXT1664(ZEXT816(0) << 0x40);
              if (pvVar6 != (void *)0x0) {
                auVar85 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar6 + local_1f0 * 0x20));
              }
              pauVar47 = (undefined1 (*) [32])
                         ((this->weight_data_tm).cstep * local_1f0 * (this->weight_data_tm).elemsize
                         + (long)(this->weight_data_tm).data);
              local_118._0_4_ = iVar40;
              if ((int)uVar58 < 8) {
                auVar158 = ZEXT864(0);
                auVar118 = ZEXT864(0);
                uVar46 = 0;
              }
              else {
                auVar118 = ZEXT864(0);
                auVar158 = ZEXT864(0);
                iVar39 = 0;
                do {
                  lVar33 = (long)(iVar39 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  puVar50 = (undefined4 *)
                            ((long)(_func_int ***)local_d8.data +
                            lVar33 + (long)(iVar45 * local_d8.elempack * (int)local_1d8) * 4);
                  if ((local_d8.elempack == 8) && (0 < iVar4)) {
                    puVar50 = (undefined4 *)
                              ((long)(_func_int ***)local_d8.data + lVar33 + (long)iVar40 * 4);
                    iVar38 = iVar4;
                    do {
                      uVar2 = *puVar50;
                      auVar81._4_4_ = uVar2;
                      auVar81._0_4_ = uVar2;
                      auVar81._8_4_ = uVar2;
                      auVar81._12_4_ = uVar2;
                      auVar81._16_4_ = uVar2;
                      auVar81._20_4_ = uVar2;
                      auVar81._24_4_ = uVar2;
                      auVar81._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar81,auVar85._0_32_,*pauVar47);
                      uVar2 = puVar50[1];
                      auVar250._4_4_ = uVar2;
                      auVar250._0_4_ = uVar2;
                      auVar250._8_4_ = uVar2;
                      auVar250._12_4_ = uVar2;
                      auVar250._16_4_ = uVar2;
                      auVar250._20_4_ = uVar2;
                      auVar250._24_4_ = uVar2;
                      auVar250._28_4_ = uVar2;
                      auVar120 = vfmadd132ps_fma(auVar250,auVar118._0_32_,pauVar47[1]);
                      uVar2 = puVar50[2];
                      auVar261._4_4_ = uVar2;
                      auVar261._0_4_ = uVar2;
                      auVar261._8_4_ = uVar2;
                      auVar261._12_4_ = uVar2;
                      auVar261._16_4_ = uVar2;
                      auVar261._20_4_ = uVar2;
                      auVar261._24_4_ = uVar2;
                      auVar261._28_4_ = uVar2;
                      auVar202 = vfmadd132ps_fma(auVar261,auVar158._0_32_,pauVar47[2]);
                      uVar2 = puVar50[3];
                      auVar280._4_4_ = uVar2;
                      auVar280._0_4_ = uVar2;
                      auVar280._8_4_ = uVar2;
                      auVar280._12_4_ = uVar2;
                      auVar280._16_4_ = uVar2;
                      auVar280._20_4_ = uVar2;
                      auVar280._24_4_ = uVar2;
                      auVar280._28_4_ = uVar2;
                      auVar160 = vfmadd132ps_fma(auVar280,auVar300._0_32_,pauVar47[3]);
                      uVar2 = puVar50[4];
                      auVar76._4_4_ = uVar2;
                      auVar76._0_4_ = uVar2;
                      auVar76._8_4_ = uVar2;
                      auVar76._12_4_ = uVar2;
                      auVar76._16_4_ = uVar2;
                      auVar76._20_4_ = uVar2;
                      auVar76._24_4_ = uVar2;
                      auVar76._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar76,ZEXT1632(auVar87),pauVar47[4]);
                      auVar85 = ZEXT1664(auVar87);
                      uVar2 = puVar50[5];
                      auVar105._4_4_ = uVar2;
                      auVar105._0_4_ = uVar2;
                      auVar105._8_4_ = uVar2;
                      auVar105._12_4_ = uVar2;
                      auVar105._16_4_ = uVar2;
                      auVar105._20_4_ = uVar2;
                      auVar105._24_4_ = uVar2;
                      auVar105._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar105,ZEXT1632(auVar120),pauVar47[5]);
                      auVar118 = ZEXT1664(auVar87);
                      uVar2 = puVar50[6];
                      auVar142._4_4_ = uVar2;
                      auVar142._0_4_ = uVar2;
                      auVar142._8_4_ = uVar2;
                      auVar142._12_4_ = uVar2;
                      auVar142._16_4_ = uVar2;
                      auVar142._20_4_ = uVar2;
                      auVar142._24_4_ = uVar2;
                      auVar142._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar142,ZEXT1632(auVar202),pauVar47[6]);
                      auVar158 = ZEXT1664(auVar87);
                      uVar2 = puVar50[7];
                      auVar296._4_4_ = uVar2;
                      auVar296._0_4_ = uVar2;
                      auVar296._8_4_ = uVar2;
                      auVar296._12_4_ = uVar2;
                      auVar296._16_4_ = uVar2;
                      auVar296._20_4_ = uVar2;
                      auVar296._24_4_ = uVar2;
                      auVar296._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar296,ZEXT1632(auVar160),pauVar47[7]);
                      auVar300 = ZEXT1664(auVar87);
                      pauVar47 = pauVar47 + 8;
                      puVar50 = puVar50 + iVar5 * 8;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  if ((local_d8.elempack == 4) && (iVar38 = iVar4, 0 < iVar4)) {
                    do {
                      uVar2 = *puVar50;
                      auVar220._4_4_ = uVar2;
                      auVar220._0_4_ = uVar2;
                      auVar220._8_4_ = uVar2;
                      auVar220._12_4_ = uVar2;
                      auVar220._16_4_ = uVar2;
                      auVar220._20_4_ = uVar2;
                      auVar220._24_4_ = uVar2;
                      auVar220._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar220,auVar85._0_32_,*pauVar47);
                      uVar2 = puVar50[1];
                      auVar251._4_4_ = uVar2;
                      auVar251._0_4_ = uVar2;
                      auVar251._8_4_ = uVar2;
                      auVar251._12_4_ = uVar2;
                      auVar251._16_4_ = uVar2;
                      auVar251._20_4_ = uVar2;
                      auVar251._24_4_ = uVar2;
                      auVar251._28_4_ = uVar2;
                      auVar120 = vfmadd132ps_fma(auVar251,auVar118._0_32_,pauVar47[1]);
                      uVar2 = puVar50[2];
                      auVar262._4_4_ = uVar2;
                      auVar262._0_4_ = uVar2;
                      auVar262._8_4_ = uVar2;
                      auVar262._12_4_ = uVar2;
                      auVar262._16_4_ = uVar2;
                      auVar262._20_4_ = uVar2;
                      auVar262._24_4_ = uVar2;
                      auVar262._28_4_ = uVar2;
                      auVar202 = vfmadd132ps_fma(auVar262,auVar158._0_32_,pauVar47[2]);
                      uVar2 = puVar50[3];
                      auVar281._4_4_ = uVar2;
                      auVar281._0_4_ = uVar2;
                      auVar281._8_4_ = uVar2;
                      auVar281._12_4_ = uVar2;
                      auVar281._16_4_ = uVar2;
                      auVar281._20_4_ = uVar2;
                      auVar281._24_4_ = uVar2;
                      auVar281._28_4_ = uVar2;
                      auVar160 = vfmadd132ps_fma(auVar281,auVar300._0_32_,pauVar47[3]);
                      uVar2 = puVar50[lVar61];
                      auVar77._4_4_ = uVar2;
                      auVar77._0_4_ = uVar2;
                      auVar77._8_4_ = uVar2;
                      auVar77._12_4_ = uVar2;
                      auVar77._16_4_ = uVar2;
                      auVar77._20_4_ = uVar2;
                      auVar77._24_4_ = uVar2;
                      auVar77._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar77,ZEXT1632(auVar87),pauVar47[4]);
                      auVar85 = ZEXT1664(auVar87);
                      uVar2 = puVar50[lVar61 + 1];
                      auVar106._4_4_ = uVar2;
                      auVar106._0_4_ = uVar2;
                      auVar106._8_4_ = uVar2;
                      auVar106._12_4_ = uVar2;
                      auVar106._16_4_ = uVar2;
                      auVar106._20_4_ = uVar2;
                      auVar106._24_4_ = uVar2;
                      auVar106._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar106,ZEXT1632(auVar120),pauVar47[5]);
                      auVar118 = ZEXT1664(auVar87);
                      uVar2 = puVar50[lVar61 + 2];
                      auVar143._4_4_ = uVar2;
                      auVar143._0_4_ = uVar2;
                      auVar143._8_4_ = uVar2;
                      auVar143._12_4_ = uVar2;
                      auVar143._16_4_ = uVar2;
                      auVar143._20_4_ = uVar2;
                      auVar143._24_4_ = uVar2;
                      auVar143._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar143,ZEXT1632(auVar202),pauVar47[6]);
                      auVar158 = ZEXT1664(auVar87);
                      uVar2 = puVar50[lVar61 + 3];
                      auVar297._4_4_ = uVar2;
                      auVar297._0_4_ = uVar2;
                      auVar297._8_4_ = uVar2;
                      auVar297._12_4_ = uVar2;
                      auVar297._16_4_ = uVar2;
                      auVar297._20_4_ = uVar2;
                      auVar297._24_4_ = uVar2;
                      auVar297._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar297,ZEXT1632(auVar160),pauVar47[7]);
                      auVar300 = ZEXT1664(auVar87);
                      pauVar47 = pauVar47 + 8;
                      puVar50 = puVar50 + iVar5 * 4;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar38 = iVar4, 0 < iVar4)) {
                    do {
                      uVar2 = *puVar50;
                      auVar221._4_4_ = uVar2;
                      auVar221._0_4_ = uVar2;
                      auVar221._8_4_ = uVar2;
                      auVar221._12_4_ = uVar2;
                      auVar221._16_4_ = uVar2;
                      auVar221._20_4_ = uVar2;
                      auVar221._24_4_ = uVar2;
                      auVar221._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar221,auVar85._0_32_,*pauVar47);
                      uVar2 = puVar50[lVar61];
                      auVar252._4_4_ = uVar2;
                      auVar252._0_4_ = uVar2;
                      auVar252._8_4_ = uVar2;
                      auVar252._12_4_ = uVar2;
                      auVar252._16_4_ = uVar2;
                      auVar252._20_4_ = uVar2;
                      auVar252._24_4_ = uVar2;
                      auVar252._28_4_ = uVar2;
                      auVar120 = vfmadd132ps_fma(auVar252,auVar118._0_32_,pauVar47[1]);
                      uVar2 = puVar50[iVar22 * 2];
                      auVar263._4_4_ = uVar2;
                      auVar263._0_4_ = uVar2;
                      auVar263._8_4_ = uVar2;
                      auVar263._12_4_ = uVar2;
                      auVar263._16_4_ = uVar2;
                      auVar263._20_4_ = uVar2;
                      auVar263._24_4_ = uVar2;
                      auVar263._28_4_ = uVar2;
                      auVar202 = vfmadd132ps_fma(auVar263,auVar158._0_32_,pauVar47[2]);
                      uVar2 = puVar50[iVar22 * 3];
                      auVar282._4_4_ = uVar2;
                      auVar282._0_4_ = uVar2;
                      auVar282._8_4_ = uVar2;
                      auVar282._12_4_ = uVar2;
                      auVar282._16_4_ = uVar2;
                      auVar282._20_4_ = uVar2;
                      auVar282._24_4_ = uVar2;
                      auVar282._28_4_ = uVar2;
                      auVar160 = vfmadd132ps_fma(auVar282,auVar300._0_32_,pauVar47[3]);
                      uVar2 = puVar50[iVar22 * 4];
                      auVar78._4_4_ = uVar2;
                      auVar78._0_4_ = uVar2;
                      auVar78._8_4_ = uVar2;
                      auVar78._12_4_ = uVar2;
                      auVar78._16_4_ = uVar2;
                      auVar78._20_4_ = uVar2;
                      auVar78._24_4_ = uVar2;
                      auVar78._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar78,ZEXT1632(auVar87),pauVar47[4]);
                      auVar85 = ZEXT1664(auVar87);
                      uVar2 = puVar50[iVar22 * 5];
                      auVar107._4_4_ = uVar2;
                      auVar107._0_4_ = uVar2;
                      auVar107._8_4_ = uVar2;
                      auVar107._12_4_ = uVar2;
                      auVar107._16_4_ = uVar2;
                      auVar107._20_4_ = uVar2;
                      auVar107._24_4_ = uVar2;
                      auVar107._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar107,ZEXT1632(auVar120),pauVar47[5]);
                      auVar118 = ZEXT1664(auVar87);
                      uVar2 = puVar50[iVar22 * 6];
                      auVar144._4_4_ = uVar2;
                      auVar144._0_4_ = uVar2;
                      auVar144._8_4_ = uVar2;
                      auVar144._12_4_ = uVar2;
                      auVar144._16_4_ = uVar2;
                      auVar144._20_4_ = uVar2;
                      auVar144._24_4_ = uVar2;
                      auVar144._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar144,ZEXT1632(auVar202),pauVar47[6]);
                      auVar158 = ZEXT1664(auVar87);
                      uVar2 = puVar50[iVar22 * 7];
                      auVar298._4_4_ = uVar2;
                      auVar298._0_4_ = uVar2;
                      auVar298._8_4_ = uVar2;
                      auVar298._12_4_ = uVar2;
                      auVar298._16_4_ = uVar2;
                      auVar298._20_4_ = uVar2;
                      auVar298._24_4_ = uVar2;
                      auVar298._28_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar298,ZEXT1632(auVar160),pauVar47[7]);
                      auVar300 = ZEXT1664(auVar87);
                      pauVar47 = pauVar47 + 8;
                      puVar50 = puVar50 + lVar26;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  iVar38 = iVar39 + 0xf;
                  iVar39 = iVar39 + 8;
                  uVar46 = uVar58 & 0xfffffff8;
                } while (iVar38 < (int)uVar58);
              }
              auVar105 = auVar300._0_32_;
              auVar76 = auVar158._0_32_;
              if ((int)(uVar46 | 3) < (int)uVar58) {
                uVar53 = uVar46;
                do {
                  lVar33 = (long)((int)uVar53 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  puVar50 = (undefined4 *)
                            ((long)(_func_int ***)local_d8.data +
                            lVar33 + (long)(iVar45 * local_d8.elempack * (int)local_1d8) * 4);
                  if ((local_d8.elempack == 4) && (0 < iVar4)) {
                    puVar50 = (undefined4 *)
                              ((long)(_func_int ***)local_d8.data + lVar33 + (long)iVar40 * 4);
                    iVar39 = iVar4;
                    do {
                      uVar2 = *puVar50;
                      auVar222._4_4_ = uVar2;
                      auVar222._0_4_ = uVar2;
                      auVar222._8_4_ = uVar2;
                      auVar222._12_4_ = uVar2;
                      auVar222._16_4_ = uVar2;
                      auVar222._20_4_ = uVar2;
                      auVar222._24_4_ = uVar2;
                      auVar222._28_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar85._0_32_,auVar222,*pauVar47);
                      auVar85 = ZEXT1664(auVar87);
                      uVar2 = puVar50[1];
                      auVar223._4_4_ = uVar2;
                      auVar223._0_4_ = uVar2;
                      auVar223._8_4_ = uVar2;
                      auVar223._12_4_ = uVar2;
                      auVar223._16_4_ = uVar2;
                      auVar223._20_4_ = uVar2;
                      auVar223._24_4_ = uVar2;
                      auVar223._28_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar118._0_32_,auVar223,pauVar47[1]);
                      auVar118 = ZEXT1664(auVar87);
                      uVar2 = puVar50[2];
                      auVar224._4_4_ = uVar2;
                      auVar224._0_4_ = uVar2;
                      auVar224._8_4_ = uVar2;
                      auVar224._12_4_ = uVar2;
                      auVar224._16_4_ = uVar2;
                      auVar224._20_4_ = uVar2;
                      auVar224._24_4_ = uVar2;
                      auVar224._28_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar158._0_32_,auVar224,pauVar47[2]);
                      auVar158 = ZEXT1664(auVar87);
                      uVar2 = puVar50[3];
                      auVar225._4_4_ = uVar2;
                      auVar225._0_4_ = uVar2;
                      auVar225._8_4_ = uVar2;
                      auVar225._12_4_ = uVar2;
                      auVar225._16_4_ = uVar2;
                      auVar225._20_4_ = uVar2;
                      auVar225._24_4_ = uVar2;
                      auVar225._28_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar300._0_32_,auVar225,pauVar47[3]);
                      auVar300 = ZEXT1664(auVar87);
                      pauVar47 = pauVar47 + 4;
                      puVar50 = puVar50 + iVar5 * 4;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar39 = iVar4, 0 < iVar4)) {
                    do {
                      uVar2 = *puVar50;
                      auVar226._4_4_ = uVar2;
                      auVar226._0_4_ = uVar2;
                      auVar226._8_4_ = uVar2;
                      auVar226._12_4_ = uVar2;
                      auVar226._16_4_ = uVar2;
                      auVar226._20_4_ = uVar2;
                      auVar226._24_4_ = uVar2;
                      auVar226._28_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar85._0_32_,auVar226,*pauVar47);
                      auVar85 = ZEXT1664(auVar87);
                      uVar2 = puVar50[lVar61];
                      auVar227._4_4_ = uVar2;
                      auVar227._0_4_ = uVar2;
                      auVar227._8_4_ = uVar2;
                      auVar227._12_4_ = uVar2;
                      auVar227._16_4_ = uVar2;
                      auVar227._20_4_ = uVar2;
                      auVar227._24_4_ = uVar2;
                      auVar227._28_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar118._0_32_,auVar227,pauVar47[1]);
                      auVar118 = ZEXT1664(auVar87);
                      uVar2 = puVar50[iVar22 * 2];
                      auVar228._4_4_ = uVar2;
                      auVar228._0_4_ = uVar2;
                      auVar228._8_4_ = uVar2;
                      auVar228._12_4_ = uVar2;
                      auVar228._16_4_ = uVar2;
                      auVar228._20_4_ = uVar2;
                      auVar228._24_4_ = uVar2;
                      auVar228._28_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar158._0_32_,auVar228,pauVar47[2]);
                      auVar158 = ZEXT1664(auVar87);
                      uVar2 = puVar50[iVar22 * 3];
                      auVar229._4_4_ = uVar2;
                      auVar229._0_4_ = uVar2;
                      auVar229._8_4_ = uVar2;
                      auVar229._12_4_ = uVar2;
                      auVar229._16_4_ = uVar2;
                      auVar229._20_4_ = uVar2;
                      auVar229._24_4_ = uVar2;
                      auVar229._28_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar300._0_32_,auVar229,pauVar47[3]);
                      auVar300 = ZEXT1664(auVar87);
                      pauVar47 = pauVar47 + 4;
                      puVar50 = puVar50 + lVar26;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar105 = auVar300._0_32_;
                  auVar76 = auVar158._0_32_;
                  uVar46 = uVar53 + 4;
                  iVar39 = uVar53 + 7;
                  uVar53 = uVar46;
                } while (iVar39 < (int)uVar58);
              }
              auVar142 = auVar118._0_32_;
              uVar29 = (ulong)uVar46;
              if ((int)(uVar46 | 1) < (int)uVar58) {
                lVar33 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                lVar34 = lVar33 * uVar29;
                lVar59 = (long)(_func_int ***)local_d8.data + lVar34 + (long)local_198;
                lVar33 = lVar33 * 2;
                lVar34 = (long)(_func_int ***)local_d8.data + lVar34 + local_1c8;
                do {
                  if (0 < iVar4) {
                    lVar57 = 0;
                    iVar39 = iVar4;
                    do {
                      uVar2 = *(undefined4 *)(lVar34 + lVar57);
                      auVar230._4_4_ = uVar2;
                      auVar230._0_4_ = uVar2;
                      auVar230._8_4_ = uVar2;
                      auVar230._12_4_ = uVar2;
                      auVar230._16_4_ = uVar2;
                      auVar230._20_4_ = uVar2;
                      auVar230._24_4_ = uVar2;
                      auVar230._28_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar85._0_32_,auVar230,*pauVar47);
                      auVar85 = ZEXT1664(auVar87);
                      uVar2 = *(undefined4 *)(lVar59 + lVar57);
                      auVar231._4_4_ = uVar2;
                      auVar231._0_4_ = uVar2;
                      auVar231._8_4_ = uVar2;
                      auVar231._12_4_ = uVar2;
                      auVar231._16_4_ = uVar2;
                      auVar231._20_4_ = uVar2;
                      auVar231._24_4_ = uVar2;
                      auVar231._28_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar118._0_32_,auVar231,pauVar47[1]);
                      auVar118 = ZEXT1664(auVar87);
                      pauVar47 = pauVar47 + 2;
                      lVar57 = lVar57 + lVar26 * 4;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar142 = auVar118._0_32_;
                  uVar29 = uVar29 + 2;
                  uVar46 = (uint)uVar29;
                  lVar59 = lVar59 + lVar33;
                  lVar34 = lVar34 + lVar33;
                } while ((int)(uVar46 | 1) < (int)uVar58);
              }
              auVar81 = auVar85._0_32_;
              if ((int)uVar46 < (int)uVar58) {
                lVar33 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                uVar29 = (ulong)uVar46;
                puVar50 = (undefined4 *)
                          ((long)(_func_int ***)local_d8.data + lVar33 * uVar29 + local_1c8);
                do {
                  puVar35 = puVar50;
                  iVar39 = iVar4;
                  if (0 < iVar4) {
                    do {
                      uVar2 = *puVar35;
                      auVar232._4_4_ = uVar2;
                      auVar232._0_4_ = uVar2;
                      auVar232._8_4_ = uVar2;
                      auVar232._12_4_ = uVar2;
                      auVar232._16_4_ = uVar2;
                      auVar232._20_4_ = uVar2;
                      auVar232._24_4_ = uVar2;
                      auVar232._28_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar85._0_32_,auVar232,*pauVar47);
                      auVar85 = ZEXT1664(auVar87);
                      pauVar47 = pauVar47 + 1;
                      puVar35 = puVar35 + lVar26;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar81 = auVar85._0_32_;
                  uVar29 = uVar29 + 1;
                  puVar50 = (undefined4 *)((long)puVar50 + lVar33);
                } while ((int)uVar29 < (int)uVar58);
              }
              fVar63 = auVar105._0_4_ + auVar76._0_4_ + auVar142._0_4_ + auVar81._0_4_;
              fVar86 = auVar105._4_4_ + auVar76._4_4_ + auVar142._4_4_ + auVar81._4_4_;
              auVar79._0_8_ = CONCAT44(fVar86,fVar63);
              auVar79._8_4_ = auVar105._8_4_ + auVar76._8_4_ + auVar142._8_4_ + auVar81._8_4_;
              auVar79._12_4_ = auVar105._12_4_ + auVar76._12_4_ + auVar142._12_4_ + auVar81._12_4_;
              auVar79._16_4_ = auVar105._16_4_ + auVar76._16_4_ + auVar142._16_4_ + auVar81._16_4_;
              auVar79._20_4_ = auVar105._20_4_ + auVar76._20_4_ + auVar142._20_4_ + auVar81._20_4_;
              auVar79._24_4_ = auVar105._24_4_ + auVar76._24_4_ + auVar142._24_4_ + auVar81._24_4_;
              auVar79._28_4_ = auVar105._28_4_ + auVar76._28_4_ + auVar142._28_4_ + auVar81._28_4_;
              auVar142 = auVar209._0_32_;
              auVar76 = auVar203._0_32_;
              auVar105 = auVar206._0_32_;
              fVar64 = auVar203._0_4_;
              fVar65 = auVar203._4_4_;
              fVar192 = auVar203._8_4_;
              fVar119 = auVar203._12_4_;
              fVar159 = auVar203._16_4_;
              fVar12 = auVar203._20_4_;
              fVar13 = auVar203._24_4_;
              fVar14 = auVar203._28_4_;
              switch(uVar32) {
              case 1:
                auVar79 = vmaxps_avx(auVar79,auVar142);
                break;
              case 2:
                auVar76 = vmaxps_avx(auVar79,auVar142);
                auVar105 = vminps_avx(auVar79,auVar142);
                uVar2 = *(this->super_Convolution1D).activation_params.data;
                auVar84._4_4_ = uVar2;
                auVar84._0_4_ = uVar2;
                auVar84._8_4_ = uVar2;
                auVar84._12_4_ = uVar2;
                auVar84._16_4_ = uVar2;
                auVar84._20_4_ = uVar2;
                auVar84._24_4_ = uVar2;
                auVar84._28_4_ = uVar2;
                auVar87 = vfmadd213ps_fma(auVar84,auVar105,auVar76);
                auVar79 = ZEXT1632(auVar87);
                break;
              case 3:
                puVar50 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
                uVar2 = *puVar50;
                auVar112._4_4_ = uVar2;
                auVar112._0_4_ = uVar2;
                auVar112._8_4_ = uVar2;
                auVar112._12_4_ = uVar2;
                auVar112._16_4_ = uVar2;
                auVar112._20_4_ = uVar2;
                auVar112._24_4_ = uVar2;
                auVar112._28_4_ = uVar2;
                uVar2 = puVar50[1];
                auVar152._4_4_ = uVar2;
                auVar152._0_4_ = uVar2;
                auVar152._8_4_ = uVar2;
                auVar152._12_4_ = uVar2;
                auVar152._16_4_ = uVar2;
                auVar152._20_4_ = uVar2;
                auVar152._24_4_ = uVar2;
                auVar152._28_4_ = uVar2;
                auVar76 = vmaxps_avx(auVar79,auVar112);
                auVar79 = vminps_avx(auVar76,auVar152);
                break;
              case 4:
                auVar80._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
                auVar80._8_4_ = -auVar79._8_4_;
                auVar80._12_4_ = -auVar79._12_4_;
                auVar80._16_4_ = -auVar79._16_4_;
                auVar80._20_4_ = -auVar79._20_4_;
                auVar80._24_4_ = -auVar79._24_4_;
                auVar80._28_4_ = -auVar79._28_4_;
                auVar113._8_4_ = 0x42b0c0a5;
                auVar113._0_8_ = 0x42b0c0a542b0c0a5;
                auVar113._12_4_ = 0x42b0c0a5;
                auVar113._16_4_ = 0x42b0c0a5;
                auVar113._20_4_ = 0x42b0c0a5;
                auVar113._24_4_ = 0x42b0c0a5;
                auVar113._28_4_ = 0x42b0c0a5;
                auVar142 = vminps_avx(auVar80,auVar113);
                auVar114._8_4_ = 0xc2b0c0a5;
                auVar114._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar114._12_4_ = 0xc2b0c0a5;
                auVar114._16_4_ = 0xc2b0c0a5;
                auVar114._20_4_ = 0xc2b0c0a5;
                auVar114._24_4_ = 0xc2b0c0a5;
                auVar114._28_4_ = 0xc2b0c0a5;
                auVar81 = vmaxps_avx(auVar142,auVar114);
                auVar115._8_4_ = 0x3fb8aa3b;
                auVar115._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar115._12_4_ = 0x3fb8aa3b;
                auVar115._16_4_ = 0x3fb8aa3b;
                auVar115._20_4_ = 0x3fb8aa3b;
                auVar115._24_4_ = 0x3fb8aa3b;
                auVar115._28_4_ = 0x3fb8aa3b;
                auVar87 = vfmadd213ps_fma(auVar115,auVar81,auVar105);
                auVar250 = vroundps_avx(ZEXT1632(auVar87),1);
                auVar142 = vcmpps_avx(ZEXT1632(auVar87),auVar250,1);
                auVar142 = vandps_avx(auVar142,auVar76);
                auVar142 = vsubps_avx(auVar250,auVar142);
                auVar153._8_4_ = 0x3f318000;
                auVar153._0_8_ = 0x3f3180003f318000;
                auVar153._12_4_ = 0x3f318000;
                auVar153._16_4_ = 0x3f318000;
                auVar153._20_4_ = 0x3f318000;
                auVar153._24_4_ = 0x3f318000;
                auVar153._28_4_ = 0x3f318000;
                auVar87 = vfmsub231ps_fma(auVar81,auVar142,auVar153);
                auVar154._8_4_ = 0x395e8083;
                auVar154._0_8_ = 0x395e8083395e8083;
                auVar154._12_4_ = 0x395e8083;
                auVar154._16_4_ = 0x395e8083;
                auVar154._20_4_ = 0x395e8083;
                auVar154._24_4_ = 0x395e8083;
                auVar154._28_4_ = 0x395e8083;
                auVar120 = vfmsub231ps_fma(ZEXT1632(auVar87),auVar142,auVar154);
                auVar81 = ZEXT1632(auVar120);
                auVar17._28_4_ = 0x395e8083;
                auVar17._0_28_ =
                     ZEXT1628(CONCAT412(auVar120._12_4_ * auVar120._12_4_,
                                        CONCAT48(auVar120._8_4_ * auVar120._8_4_,
                                                 CONCAT44(auVar120._4_4_ * auVar120._4_4_,
                                                          auVar120._0_4_ * auVar120._0_4_))));
                auVar236._8_4_ = 0x39506967;
                auVar236._0_8_ = 0x3950696739506967;
                auVar236._12_4_ = 0x39506967;
                auVar236._16_4_ = 0x39506967;
                auVar236._20_4_ = 0x39506967;
                auVar236._24_4_ = 0x39506967;
                auVar236._28_4_ = 0x39506967;
                auVar200._8_4_ = 0x3ab743ce;
                auVar200._0_8_ = 0x3ab743ce3ab743ce;
                auVar200._12_4_ = 0x3ab743ce;
                auVar200._16_4_ = 0x3ab743ce;
                auVar200._20_4_ = 0x3ab743ce;
                auVar200._24_4_ = 0x3ab743ce;
                auVar200._28_4_ = 0x3ab743ce;
                auVar87 = vfmadd213ps_fma(auVar236,auVar81,auVar200);
                auVar201._8_4_ = 0x3c088908;
                auVar201._0_8_ = 0x3c0889083c088908;
                auVar201._12_4_ = 0x3c088908;
                auVar201._16_4_ = 0x3c088908;
                auVar201._20_4_ = 0x3c088908;
                auVar201._24_4_ = 0x3c088908;
                auVar201._28_4_ = 0x3c088908;
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar81,auVar201);
                auVar188._8_4_ = 0x3d2aa9c1;
                auVar188._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar188._12_4_ = 0x3d2aa9c1;
                auVar188._16_4_ = 0x3d2aa9c1;
                auVar188._20_4_ = 0x3d2aa9c1;
                auVar188._24_4_ = 0x3d2aa9c1;
                auVar188._28_4_ = 0x3d2aa9c1;
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar81,auVar188);
                auVar189._8_4_ = 0x3e2aaaaa;
                auVar189._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar189._12_4_ = 0x3e2aaaaa;
                auVar189._16_4_ = 0x3e2aaaaa;
                auVar189._20_4_ = 0x3e2aaaaa;
                auVar189._24_4_ = 0x3e2aaaaa;
                auVar189._28_4_ = 0x3e2aaaaa;
                auVar81 = ZEXT1632(auVar120);
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar81,auVar189);
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar81,auVar105);
                auVar202 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar17,auVar81);
                auVar66._0_4_ = (int)auVar142._0_4_;
                auVar66._4_4_ = (int)auVar142._4_4_;
                auVar66._8_4_ = (int)auVar142._8_4_;
                auVar66._12_4_ = (int)auVar142._12_4_;
                auVar82._16_4_ = (int)auVar142._16_4_;
                auVar82._0_16_ = auVar66;
                auVar82._20_4_ = (int)auVar142._20_4_;
                auVar82._24_4_ = (int)auVar142._24_4_;
                auVar82._28_4_ = (int)auVar142._28_4_;
                auVar120 = vpslld_avx(auVar66,0x17);
                auVar87 = vpslld_avx(auVar82._16_16_,0x17);
                auVar121._8_4_ = 0x3f800000;
                auVar121._0_8_ = 0x3f8000003f800000;
                auVar121._12_4_ = 0x3f800000;
                auVar87 = vpaddd_avx(auVar87,auVar121);
                auVar120 = vpaddd_avx(auVar120,auVar121);
                auVar83._16_16_ = auVar87;
                auVar83._0_16_ = auVar120;
                auVar116._0_4_ = auVar202._0_4_ + fVar64;
                auVar116._4_4_ = auVar202._4_4_ + fVar65;
                auVar116._8_4_ = auVar202._8_4_ + fVar192;
                auVar116._12_4_ = auVar202._12_4_ + fVar119;
                auVar116._16_4_ = fVar159 + 0.0;
                auVar116._20_4_ = fVar12 + 0.0;
                auVar116._24_4_ = fVar13 + 0.0;
                auVar116._28_4_ = fVar14 + 0.0;
                auVar87 = vfmadd213ps_fma(auVar83,auVar116,auVar76);
                auVar79 = vdivps_avx(auVar76,ZEXT1632(auVar87));
                break;
              case 5:
                auVar299._8_4_ = 0x42b0c0a5;
                auVar299._0_8_ = 0x42b0c0a542b0c0a5;
                auVar299._12_4_ = 0x42b0c0a5;
                auVar299._16_4_ = 0x42b0c0a5;
                auVar299._20_4_ = 0x42b0c0a5;
                auVar299._24_4_ = 0x42b0c0a5;
                auVar299._28_4_ = 0x42b0c0a5;
                auVar142 = vminps_avx(auVar299,auVar79);
                auVar293._8_4_ = 0xc2b0c0a5;
                auVar293._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar293._12_4_ = 0xc2b0c0a5;
                auVar293._16_4_ = 0xc2b0c0a5;
                auVar293._20_4_ = 0xc2b0c0a5;
                auVar293._24_4_ = 0xc2b0c0a5;
                auVar293._28_4_ = 0xc2b0c0a5;
                auVar81 = vmaxps_avx(auVar293,auVar142);
                auVar145._8_4_ = 0x3fb8aa3b;
                auVar145._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar145._12_4_ = 0x3fb8aa3b;
                auVar145._16_4_ = 0x3fb8aa3b;
                auVar145._20_4_ = 0x3fb8aa3b;
                auVar145._24_4_ = 0x3fb8aa3b;
                auVar145._28_4_ = 0x3fb8aa3b;
                auVar87 = vfmadd213ps_fma(auVar145,auVar81,auVar105);
                auVar250 = vroundps_avx(ZEXT1632(auVar87),1);
                auVar142 = vcmpps_avx(ZEXT1632(auVar87),auVar250,1);
                auVar142 = vandps_avx(auVar142,auVar76);
                auVar142 = vsubps_avx(auVar250,auVar142);
                auVar87 = vfmsub231ps_fma(auVar81,auVar142,auVar305);
                auVar294._8_4_ = 0xb95e8083;
                auVar294._0_8_ = 0xb95e8083b95e8083;
                auVar294._12_4_ = 0xb95e8083;
                auVar294._16_4_ = 0xb95e8083;
                auVar294._20_4_ = 0xb95e8083;
                auVar294._24_4_ = 0xb95e8083;
                auVar294._28_4_ = 0xb95e8083;
                auVar120 = vfnmsub231ps_fma(ZEXT1632(auVar87),auVar142,auVar294);
                auVar81 = ZEXT1632(auVar120);
                auVar15._28_4_ = auVar250._28_4_;
                auVar15._0_28_ =
                     ZEXT1628(CONCAT412(auVar120._12_4_ * auVar120._12_4_,
                                        CONCAT48(auVar120._8_4_ * auVar120._8_4_,
                                                 CONCAT44(auVar120._4_4_ * auVar120._4_4_,
                                                          auVar120._0_4_ * auVar120._0_4_))));
                auVar253._8_4_ = 0x39506967;
                auVar253._0_8_ = 0x3950696739506967;
                auVar253._12_4_ = 0x39506967;
                auVar253._16_4_ = 0x39506967;
                auVar253._20_4_ = 0x39506967;
                auVar253._24_4_ = 0x39506967;
                auVar253._28_4_ = 0x39506967;
                auVar198._8_4_ = 0x3ab743ce;
                auVar198._0_8_ = 0x3ab743ce3ab743ce;
                auVar198._12_4_ = 0x3ab743ce;
                auVar198._16_4_ = 0x3ab743ce;
                auVar198._20_4_ = 0x3ab743ce;
                auVar198._24_4_ = 0x3ab743ce;
                auVar198._28_4_ = 0x3ab743ce;
                auVar87 = vfmadd213ps_fma(auVar253,auVar81,auVar198);
                auVar208._8_4_ = 0x3c088908;
                auVar208._0_8_ = 0x3c0889083c088908;
                auVar208._12_4_ = 0x3c088908;
                auVar208._16_4_ = 0x3c088908;
                auVar208._20_4_ = 0x3c088908;
                auVar208._24_4_ = 0x3c088908;
                auVar208._28_4_ = 0x3c088908;
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar81,auVar208);
                auVar187._8_4_ = 0x3d2aa9c1;
                auVar187._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar187._12_4_ = 0x3d2aa9c1;
                auVar187._16_4_ = 0x3d2aa9c1;
                auVar187._20_4_ = 0x3d2aa9c1;
                auVar187._24_4_ = 0x3d2aa9c1;
                auVar187._28_4_ = 0x3d2aa9c1;
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar81,auVar187);
                auVar205._8_4_ = 0x3e2aaaaa;
                auVar205._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar205._12_4_ = 0x3e2aaaaa;
                auVar205._16_4_ = 0x3e2aaaaa;
                auVar205._20_4_ = 0x3e2aaaaa;
                auVar205._24_4_ = 0x3e2aaaaa;
                auVar205._28_4_ = 0x3e2aaaaa;
                auVar81 = ZEXT1632(auVar120);
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar81,auVar205);
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar81,auVar105);
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar15,auVar81);
                auVar233._0_4_ = auVar87._0_4_ + fVar64;
                auVar233._4_4_ = auVar87._4_4_ + fVar65;
                auVar233._8_4_ = auVar87._8_4_ + fVar192;
                auVar233._12_4_ = auVar87._12_4_ + fVar119;
                auVar233._16_4_ = fVar159 + 0.0;
                auVar233._20_4_ = fVar12 + 0.0;
                auVar233._24_4_ = fVar13 + 0.0;
                auVar233._28_4_ = fVar14 + 0.0;
                auVar87._0_4_ = (int)auVar142._0_4_;
                auVar87._4_4_ = (int)auVar142._4_4_;
                auVar87._8_4_ = (int)auVar142._8_4_;
                auVar87._12_4_ = (int)auVar142._12_4_;
                auVar108._16_4_ = (int)auVar142._16_4_;
                auVar108._0_16_ = auVar87;
                auVar108._20_4_ = (int)auVar142._20_4_;
                auVar108._24_4_ = (int)auVar142._24_4_;
                auVar108._28_4_ = (int)auVar142._28_4_;
                auVar120 = vpslld_avx(auVar87,0x17);
                auVar87 = vpslld_avx(auVar108._16_16_,0x17);
                auVar160._8_4_ = 0x3f800000;
                auVar160._0_8_ = 0x3f8000003f800000;
                auVar160._12_4_ = 0x3f800000;
                auVar87 = vpaddd_avx(auVar87,auVar160);
                auVar120 = vpaddd_avx(auVar120,auVar160);
                auVar109._16_16_ = auVar87;
                auVar109._0_16_ = auVar120;
                auVar202 = vfmadd213ps_fma(auVar109,auVar233,auVar76);
                auVar146._8_4_ = 0x800000;
                auVar146._0_8_ = 0x80000000800000;
                auVar146._12_4_ = 0x800000;
                auVar146._16_4_ = 0x800000;
                auVar146._20_4_ = 0x800000;
                auVar146._24_4_ = 0x800000;
                auVar146._28_4_ = 0x800000;
                auVar142 = vmaxps_avx(ZEXT1632(auVar202),auVar146);
                auVar120 = vpsrld_avx(auVar142._0_16_,0x17);
                auVar87 = vpsrld_avx(auVar142._16_16_,0x17);
                auVar264._8_4_ = 0x807fffff;
                auVar264._0_8_ = 0x807fffff807fffff;
                auVar264._12_4_ = 0x807fffff;
                auVar264._16_4_ = 0x807fffff;
                auVar264._20_4_ = 0x807fffff;
                auVar264._24_4_ = 0x807fffff;
                auVar264._28_4_ = 0x807fffff;
                auVar142 = vandps_avx(auVar264,auVar142);
                auVar250 = vorps_avx(auVar142,auVar105);
                auVar265._8_4_ = 0x3f3504f3;
                auVar265._0_8_ = 0x3f3504f33f3504f3;
                auVar265._12_4_ = 0x3f3504f3;
                auVar265._16_4_ = 0x3f3504f3;
                auVar265._20_4_ = 0x3f3504f3;
                auVar265._24_4_ = 0x3f3504f3;
                auVar265._28_4_ = 0x3f3504f3;
                auVar81 = vcmpps_avx(auVar265,auVar250,2);
                auVar142 = vandnps_avx(auVar81,auVar250);
                auVar199._8_4_ = 0xbf800000;
                auVar199._0_8_ = 0xbf800000bf800000;
                auVar199._12_4_ = 0xbf800000;
                auVar199._16_4_ = 0xbf800000;
                auVar199._20_4_ = 0xbf800000;
                auVar199._24_4_ = 0xbf800000;
                auVar199._28_4_ = 0xbf800000;
                auVar147._0_4_ = auVar142._0_4_ + auVar250._0_4_ + -1.0;
                auVar147._4_4_ = auVar142._4_4_ + auVar250._4_4_ + -1.0;
                auVar147._8_4_ = auVar142._8_4_ + auVar250._8_4_ + -1.0;
                auVar147._12_4_ = auVar142._12_4_ + auVar250._12_4_ + -1.0;
                auVar147._16_4_ = auVar142._16_4_ + auVar250._16_4_ + -1.0;
                auVar147._20_4_ = auVar142._20_4_ + auVar250._20_4_ + -1.0;
                auVar147._24_4_ = auVar142._24_4_ + auVar250._24_4_ + -1.0;
                auVar147._28_4_ = auVar142._28_4_ + auVar250._28_4_ + -1.0;
                auVar87 = vpsubd_avx(auVar87,auVar81._16_16_);
                auVar268._8_4_ = 0xffffff81;
                auVar268._0_8_ = 0xffffff81ffffff81;
                auVar268._12_4_ = 0xffffff81;
                auVar87 = vpaddd_avx(auVar87,auVar268);
                auVar120 = vpsubd_avx(auVar120,auVar81._0_16_);
                auVar120 = vpaddd_avx(auVar120,auVar268);
                auVar234._16_16_ = auVar87;
                auVar234._0_16_ = auVar120;
                auVar254._0_4_ = auVar147._0_4_ * auVar147._0_4_;
                auVar254._4_4_ = auVar147._4_4_ * auVar147._4_4_;
                auVar254._8_4_ = auVar147._8_4_ * auVar147._8_4_;
                auVar254._12_4_ = auVar147._12_4_ * auVar147._12_4_;
                auVar254._16_4_ = auVar147._16_4_ * auVar147._16_4_;
                auVar254._20_4_ = auVar147._20_4_ * auVar147._20_4_;
                auVar254._24_4_ = auVar147._24_4_ * auVar147._24_4_;
                auVar254._28_4_ = 0;
                auVar266._8_4_ = 0x3d9021bb;
                auVar266._0_8_ = 0x3d9021bb3d9021bb;
                auVar266._12_4_ = 0x3d9021bb;
                auVar266._16_4_ = 0x3d9021bb;
                auVar266._20_4_ = 0x3d9021bb;
                auVar266._24_4_ = 0x3d9021bb;
                auVar266._28_4_ = 0x3d9021bb;
                auVar283._8_4_ = 0xbdebd1b8;
                auVar283._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar283._12_4_ = 0xbdebd1b8;
                auVar283._16_4_ = 0xbdebd1b8;
                auVar283._20_4_ = 0xbdebd1b8;
                auVar283._24_4_ = 0xbdebd1b8;
                auVar283._28_4_ = 0xbdebd1b8;
                auVar87 = vfmadd213ps_fma(auVar266,auVar147,auVar283);
                auVar284._8_4_ = 0x3def251a;
                auVar284._0_8_ = 0x3def251a3def251a;
                auVar284._12_4_ = 0x3def251a;
                auVar284._16_4_ = 0x3def251a;
                auVar284._20_4_ = 0x3def251a;
                auVar284._24_4_ = 0x3def251a;
                auVar284._28_4_ = 0x3def251a;
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar147,auVar284);
                auVar285._8_4_ = 0xbdfe5d4f;
                auVar285._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar285._12_4_ = 0xbdfe5d4f;
                auVar285._16_4_ = 0xbdfe5d4f;
                auVar285._20_4_ = 0xbdfe5d4f;
                auVar285._24_4_ = 0xbdfe5d4f;
                auVar285._28_4_ = 0xbdfe5d4f;
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar147,auVar285);
                auVar286._8_4_ = 0x3e11e9bf;
                auVar286._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar286._12_4_ = 0x3e11e9bf;
                auVar286._16_4_ = 0x3e11e9bf;
                auVar286._20_4_ = 0x3e11e9bf;
                auVar286._24_4_ = 0x3e11e9bf;
                auVar286._28_4_ = 0x3e11e9bf;
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar147,auVar286);
                auVar287._8_4_ = 0xbe2aae50;
                auVar287._0_8_ = 0xbe2aae50be2aae50;
                auVar287._12_4_ = 0xbe2aae50;
                auVar287._16_4_ = 0xbe2aae50;
                auVar287._20_4_ = 0xbe2aae50;
                auVar287._24_4_ = 0xbe2aae50;
                auVar287._28_4_ = 0xbe2aae50;
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar147,auVar287);
                auVar288._8_4_ = 0x3e4cceac;
                auVar288._0_8_ = 0x3e4cceac3e4cceac;
                auVar288._12_4_ = 0x3e4cceac;
                auVar288._16_4_ = 0x3e4cceac;
                auVar288._20_4_ = 0x3e4cceac;
                auVar288._24_4_ = 0x3e4cceac;
                auVar288._28_4_ = 0x3e4cceac;
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar147,auVar288);
                auVar289._8_4_ = 0xbe7ffffc;
                auVar289._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar289._12_4_ = 0xbe7ffffc;
                auVar289._16_4_ = 0xbe7ffffc;
                auVar289._20_4_ = 0xbe7ffffc;
                auVar289._24_4_ = 0xbe7ffffc;
                auVar289._28_4_ = 0xbe7ffffc;
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar147,auVar289);
                auVar290._8_4_ = 0x3eaaaaaa;
                auVar290._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar290._12_4_ = 0x3eaaaaaa;
                auVar290._16_4_ = 0x3eaaaaaa;
                auVar290._20_4_ = 0x3eaaaaaa;
                auVar290._24_4_ = 0x3eaaaaaa;
                auVar290._28_4_ = 0x3eaaaaaa;
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar147,auVar290);
                auVar267._0_4_ = auVar254._0_4_ * auVar147._0_4_ * auVar87._0_4_;
                auVar267._4_4_ = auVar254._4_4_ * auVar147._4_4_ * auVar87._4_4_;
                auVar267._8_4_ = auVar254._8_4_ * auVar147._8_4_ * auVar87._8_4_;
                auVar267._12_4_ = auVar254._12_4_ * auVar147._12_4_ * auVar87._12_4_;
                auVar267._16_4_ = auVar254._16_4_ * auVar147._16_4_ * 0.0;
                auVar267._20_4_ = auVar254._20_4_ * auVar147._20_4_ * 0.0;
                auVar267._24_4_ = auVar254._24_4_ * auVar147._24_4_ * 0.0;
                auVar267._28_4_ = 0;
                auVar81 = vcvtdq2ps_avx(auVar234);
                auVar87 = vfmadd231ps_fma(auVar267,auVar81,auVar294);
                auVar87 = vfmsub231ps_fma(ZEXT1632(auVar87),auVar105,auVar254);
                auVar142 = vcmpps_avx(ZEXT1632(auVar202),_DAT_005f5320,2);
                auVar250 = vsubps_avx(ZEXT1632(auVar87),auVar147);
                auVar87 = vfmsub231ps_fma(auVar250,auVar305,auVar81);
                auVar291._8_4_ = 0xc0000000;
                auVar291._0_8_ = 0xc0000000c0000000;
                auVar291._12_4_ = 0xc0000000;
                auVar291._16_4_ = 0xc0000000;
                auVar291._20_4_ = 0xc0000000;
                auVar291._24_4_ = 0xc0000000;
                auVar291._28_4_ = 0xc0000000;
                auVar148._0_4_ = auVar87._0_4_ * -2.0;
                auVar148._4_4_ = auVar87._4_4_ * -2.0;
                auVar148._8_4_ = auVar87._8_4_ * -2.0;
                auVar148._12_4_ = auVar87._12_4_ * -2.0;
                auVar148._16_4_ = 0x80000000;
                auVar148._20_4_ = 0x80000000;
                auVar148._24_4_ = 0x80000000;
                auVar148._28_4_ = 0;
                auVar235._8_4_ = 0x7fffffff;
                auVar235._0_8_ = 0x7fffffff7fffffff;
                auVar235._12_4_ = 0x7fffffff;
                auVar235._16_4_ = 0x7fffffff;
                auVar235._20_4_ = 0x7fffffff;
                auVar235._24_4_ = 0x7fffffff;
                auVar235._28_4_ = 0x7fffffff;
                auVar142 = vblendvps_avx(auVar148,auVar235,auVar142);
                auVar142 = vminps_avx(auVar299,auVar142);
                auVar149._8_4_ = 0xc2b0c0a5;
                auVar149._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar149._12_4_ = 0xc2b0c0a5;
                auVar149._16_4_ = 0xc2b0c0a5;
                auVar149._20_4_ = 0xc2b0c0a5;
                auVar149._24_4_ = 0xc2b0c0a5;
                auVar149._28_4_ = 0xc2b0c0a5;
                auVar81 = vmaxps_avx(auVar142,auVar149);
                auVar150._8_4_ = 0x3fb8aa3b;
                auVar150._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar150._12_4_ = 0x3fb8aa3b;
                auVar150._16_4_ = 0x3fb8aa3b;
                auVar150._20_4_ = 0x3fb8aa3b;
                auVar150._24_4_ = 0x3fb8aa3b;
                auVar150._28_4_ = 0x3fb8aa3b;
                auVar87 = vfmadd213ps_fma(auVar150,auVar81,auVar105);
                auVar250 = vroundps_avx(ZEXT1632(auVar87),1);
                auVar142 = vcmpps_avx(ZEXT1632(auVar87),auVar250,1);
                auVar142 = vandps_avx(auVar76,auVar142);
                auVar142 = vsubps_avx(auVar250,auVar142);
                auVar87 = vfmsub231ps_fma(auVar81,auVar142,auVar305);
                auVar120 = vfnmsub231ps_fma(ZEXT1632(auVar87),auVar142,auVar294);
                auVar81 = ZEXT1632(auVar120);
                auVar16._28_4_ = auVar250._28_4_;
                auVar16._0_28_ =
                     ZEXT1628(CONCAT412(auVar120._12_4_ * auVar120._12_4_,
                                        CONCAT48(auVar120._8_4_ * auVar120._8_4_,
                                                 CONCAT44(auVar120._4_4_ * auVar120._4_4_,
                                                          auVar120._0_4_ * auVar120._0_4_))));
                auVar255._8_4_ = 0x39506967;
                auVar255._0_8_ = 0x3950696739506967;
                auVar255._12_4_ = 0x39506967;
                auVar255._16_4_ = 0x39506967;
                auVar255._20_4_ = 0x39506967;
                auVar255._24_4_ = 0x39506967;
                auVar255._28_4_ = 0x39506967;
                auVar203 = ZEXT3264(auVar76);
                auVar247._8_4_ = 0x3ab743ce;
                auVar247._0_8_ = 0x3ab743ce3ab743ce;
                auVar247._12_4_ = 0x3ab743ce;
                auVar247._16_4_ = 0x3ab743ce;
                auVar247._20_4_ = 0x3ab743ce;
                auVar247._24_4_ = 0x3ab743ce;
                auVar247._28_4_ = 0x3ab743ce;
                auVar87 = vfmadd213ps_fma(auVar255,auVar81,auVar247);
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar81,auVar208);
                auVar209 = ZEXT864(0) << 0x20;
                auVar248._8_4_ = 0x3d2aa9c1;
                auVar248._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar248._12_4_ = 0x3d2aa9c1;
                auVar248._16_4_ = 0x3d2aa9c1;
                auVar248._20_4_ = 0x3d2aa9c1;
                auVar248._24_4_ = 0x3d2aa9c1;
                auVar248._28_4_ = 0x3d2aa9c1;
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar81,auVar248);
                auVar81 = ZEXT1632(auVar120);
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar81,auVar205);
                auVar206 = ZEXT3264(auVar105);
                auVar87 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar81,auVar105);
                auVar202 = vfmadd213ps_fma(ZEXT1632(auVar87),auVar16,auVar81);
                auVar120._0_4_ = (int)auVar142._0_4_;
                auVar120._4_4_ = (int)auVar142._4_4_;
                auVar120._8_4_ = (int)auVar142._8_4_;
                auVar120._12_4_ = (int)auVar142._12_4_;
                auVar110._16_4_ = (int)auVar142._16_4_;
                auVar110._0_16_ = auVar120;
                auVar110._20_4_ = (int)auVar142._20_4_;
                auVar110._24_4_ = (int)auVar142._24_4_;
                auVar110._28_4_ = (int)auVar142._28_4_;
                auVar120 = vpslld_avx(auVar120,0x17);
                auVar87 = vpslld_avx(auVar110._16_16_,0x17);
                auVar87 = vpaddd_avx(auVar87,auVar160);
                auVar120 = vpaddd_avx(auVar120,auVar160);
                auVar111._16_16_ = auVar87;
                auVar111._0_16_ = auVar120;
                auVar151._0_4_ = auVar202._0_4_ + fVar64;
                auVar151._4_4_ = auVar202._4_4_ + fVar65;
                auVar151._8_4_ = auVar202._8_4_ + fVar192;
                auVar151._12_4_ = auVar202._12_4_ + fVar119;
                auVar151._16_4_ = fVar159 + 0.0;
                auVar151._20_4_ = fVar12 + 0.0;
                auVar151._24_4_ = fVar13 + 0.0;
                auVar151._28_4_ = fVar14 + 0.0;
                auVar87 = vfmadd213ps_fma(auVar111,auVar151,auVar76);
                auVar76 = vdivps_avx(auVar76,ZEXT1632(auVar87));
                auVar87 = vfnmadd213ps_fma(auVar76,auVar291,auVar199);
                auVar104 = ZEXT1628(auVar87);
                goto LAB_005804c6;
              case 6:
                puVar50 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
                uVar2 = *puVar50;
                auVar117._4_4_ = uVar2;
                auVar117._0_4_ = uVar2;
                auVar117._8_4_ = uVar2;
                auVar117._12_4_ = uVar2;
                auVar117._16_4_ = uVar2;
                auVar117._20_4_ = uVar2;
                auVar117._24_4_ = uVar2;
                auVar117._28_4_ = uVar2;
                uVar2 = puVar50[1];
                auVar155._4_4_ = uVar2;
                auVar155._0_4_ = uVar2;
                auVar155._8_4_ = uVar2;
                auVar155._12_4_ = uVar2;
                auVar155._16_4_ = uVar2;
                auVar155._20_4_ = uVar2;
                auVar155._24_4_ = uVar2;
                auVar155._28_4_ = uVar2;
                auVar87 = vfmadd231ps_fma(auVar155,auVar79,auVar117);
                auVar105 = vmaxps_avx(ZEXT1632(auVar87),auVar142);
                auVar76 = vminps_avx(auVar105,auVar76);
                auVar104 = auVar76._0_28_;
LAB_005804c6:
                auVar79._4_4_ = auVar104._4_4_ * fVar86;
                auVar79._0_4_ = auVar104._0_4_ * fVar63;
                auVar79._8_4_ = auVar104._8_4_ * auVar79._8_4_;
                auVar79._12_4_ = auVar104._12_4_ * auVar79._12_4_;
                auVar79._16_4_ = auVar104._16_4_ * auVar79._16_4_;
                auVar79._20_4_ = auVar104._20_4_ * auVar79._20_4_;
                auVar79._24_4_ = auVar104._24_4_ * auVar79._24_4_;
              }
              if (iVar56 == 8) {
                *local_1c0 = auVar79;
                local_1c0 = local_1c0 + 1;
              }
              auVar120 = auVar79._16_16_;
              auVar87 = auVar79._0_16_;
              if (iVar56 == 4) {
                *(undefined1 (*) [16])*local_1c0 = auVar87;
                *(undefined1 (*) [16])((long)*local_1c0 + lVar54 * 4) = auVar120;
                local_1c0 = (undefined1 (*) [32])((long)*local_1c0 + 0x10);
              }
              if (iVar56 == 1) {
                *(int *)*local_1c0 = auVar79._0_4_;
                uVar2 = vextractps_avx(auVar87,1);
                *(undefined4 *)((long)*local_1c0 + lVar54 * 4) = uVar2;
                uVar2 = vextractps_avx(auVar87,2);
                *(undefined4 *)((long)*local_1c0 + (long)(iVar25 * 2) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar87,3);
                *(undefined4 *)((long)*local_1c0 + (long)(iVar25 * 3) * 4) = uVar2;
                *(int *)((long)*local_1c0 + (long)(iVar25 * 4) * 4) = auVar79._16_4_;
                uVar2 = vextractps_avx(auVar120,1);
                *(undefined4 *)((long)*local_1c0 + (long)(iVar25 * 5) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar120,2);
                *(undefined4 *)((long)*local_1c0 + (long)(iVar25 * 6) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar120,3);
                *(undefined4 *)((long)*local_1c0 + local_90 * 4) = uVar2;
                local_1c0 = (undefined1 (*) [32])((long)*local_1c0 + 4);
              }
              local_1d8 = local_1d8 + 1;
              iVar40 = iVar40 + iVar45 * local_d8.elempack;
              local_198 = (Allocator *)((long)local_198 + lVar27 * 4);
              local_1c8 = local_1c8 + lVar27 * 4;
            } while (local_1d8 != lVar28);
          }
          local_1f0 = local_1f0 + 1;
        } while (local_1f0 != uVar37);
      }
      iVar40 = iVar24 + uVar37 * -8;
      iVar56 = iVar40 + 3;
      if (-1 < iVar40) {
        iVar56 = iVar40;
      }
      if (3 < iVar40) {
        local_90 = lVar61 * 4;
        auVar203 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar202._8_4_ = 0x3f000000;
        auVar202._0_8_ = 0x3f0000003f000000;
        auVar202._12_4_ = 0x3f000000;
        auVar204._8_4_ = 0x3f800000;
        auVar204._0_8_ = 0x3f8000003f800000;
        auVar204._12_4_ = 0x3f800000;
        local_148 = 0;
        auVar292._8_4_ = 0xc2b0c0a5;
        auVar292._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar292._12_4_ = 0xc2b0c0a5;
        auVar295._8_4_ = 0x3ab743ce;
        auVar295._0_8_ = 0x3ab743ce3ab743ce;
        auVar295._12_4_ = 0x3ab743ce;
        auVar207._8_4_ = 0x3e2aaaaa;
        auVar207._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar207._12_4_ = 0x3e2aaaaa;
        do {
          lVar54 = (long)top_blob->w;
          if (0 < lVar54) {
            uVar46 = local_d8.h * local_d8.elempack;
            uVar29 = (long)(int)(uVar37 * 8) + local_148 * 4;
            iVar40 = top_blob->elempack;
            uVar53 = (uint)uVar29;
            local_1c0 = (undefined1 (*) [32])
                        ((int)((long)((ulong)(uint)((int)uVar53 >> 0x1f) << 0x20 |
                                     uVar29 & 0xffffffff) / (long)iVar40) * lVar54 *
                         top_blob->elemsize + (long)top_blob->data);
            uVar58 = uVar53 + 7;
            if (-1 < (int)uVar53) {
              uVar58 = uVar53;
            }
            local_1c8 = 0;
            iVar39 = 0;
            local_1d8 = 0;
            local_198 = (Allocator *)local_90;
            do {
              auVar206 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar87 = ZEXT816(0) << 0x40;
              if (pvVar6 != (void *)0x0) {
                auVar87 = *(undefined1 (*) [16])((long)pvVar6 + uVar29 * 4);
              }
              auVar209 = ZEXT1664(auVar87);
              local_118._0_4_ = iVar39;
              pauVar48 = (undefined1 (*) [16])
                         ((this->weight_data_tm).cstep *
                          (long)(((int)(uVar53 - (uVar58 & 0xfffffff8)) >> 2) + ((int)uVar58 >> 3))
                          * (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
              if ((int)uVar46 < 8) {
                auVar85 = ZEXT864(0);
                auVar300 = ZEXT864(0);
                uVar23 = 0;
              }
              else {
                auVar300 = ZEXT864(0);
                auVar85 = ZEXT864(0);
                iVar38 = 0;
                do {
                  lVar28 = (long)(iVar38 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  puVar50 = (undefined4 *)
                            ((long)(_func_int ***)local_d8.data +
                            lVar28 + (long)(local_d8.elempack * iVar45 * (int)local_1d8) * 4);
                  if ((local_d8.elempack == 8) && (0 < iVar4)) {
                    puVar50 = (undefined4 *)
                              ((long)(_func_int ***)local_d8.data + lVar28 + (long)iVar39 * 4);
                    iVar41 = iVar4;
                    do {
                      uVar2 = *puVar50;
                      auVar161._4_4_ = uVar2;
                      auVar161._0_4_ = uVar2;
                      auVar161._8_4_ = uVar2;
                      auVar161._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar161,auVar209._0_16_,*pauVar48);
                      uVar2 = puVar50[1];
                      auVar237._4_4_ = uVar2;
                      auVar237._0_4_ = uVar2;
                      auVar237._8_4_ = uVar2;
                      auVar237._12_4_ = uVar2;
                      auVar120 = vfmadd132ps_fma(auVar237,auVar300._0_16_,pauVar48[1]);
                      uVar2 = puVar50[2];
                      auVar256._4_4_ = uVar2;
                      auVar256._0_4_ = uVar2;
                      auVar256._8_4_ = uVar2;
                      auVar256._12_4_ = uVar2;
                      auVar160 = vfmadd132ps_fma(auVar256,auVar85._0_16_,pauVar48[2]);
                      uVar2 = puVar50[3];
                      auVar269._4_4_ = uVar2;
                      auVar269._0_4_ = uVar2;
                      auVar269._8_4_ = uVar2;
                      auVar269._12_4_ = uVar2;
                      auVar268 = vfmadd132ps_fma(auVar269,auVar206._0_16_,pauVar48[3]);
                      uVar2 = puVar50[4];
                      auVar210._4_4_ = uVar2;
                      auVar210._0_4_ = uVar2;
                      auVar210._8_4_ = uVar2;
                      auVar210._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar210,auVar87,pauVar48[4]);
                      auVar209 = ZEXT1664(auVar87);
                      uVar2 = puVar50[5];
                      auVar301._4_4_ = uVar2;
                      auVar301._0_4_ = uVar2;
                      auVar301._8_4_ = uVar2;
                      auVar301._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar301,auVar120,pauVar48[5]);
                      auVar300 = ZEXT1664(auVar87);
                      uVar2 = puVar50[6];
                      auVar122._4_4_ = uVar2;
                      auVar122._0_4_ = uVar2;
                      auVar122._8_4_ = uVar2;
                      auVar122._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar122,auVar160,pauVar48[6]);
                      auVar85 = ZEXT1664(auVar87);
                      uVar2 = puVar50[7];
                      auVar88._4_4_ = uVar2;
                      auVar88._0_4_ = uVar2;
                      auVar88._8_4_ = uVar2;
                      auVar88._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar88,auVar268,pauVar48[7]);
                      auVar206 = ZEXT1664(auVar87);
                      pauVar48 = pauVar48 + 8;
                      puVar50 = puVar50 + iVar5 * 8;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  if ((local_d8.elempack == 4) && (iVar41 = iVar4, 0 < iVar4)) {
                    do {
                      uVar2 = *puVar50;
                      auVar162._4_4_ = uVar2;
                      auVar162._0_4_ = uVar2;
                      auVar162._8_4_ = uVar2;
                      auVar162._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar162,auVar209._0_16_,*pauVar48);
                      uVar2 = puVar50[1];
                      auVar238._4_4_ = uVar2;
                      auVar238._0_4_ = uVar2;
                      auVar238._8_4_ = uVar2;
                      auVar238._12_4_ = uVar2;
                      auVar120 = vfmadd132ps_fma(auVar238,auVar300._0_16_,pauVar48[1]);
                      uVar2 = puVar50[2];
                      auVar257._4_4_ = uVar2;
                      auVar257._0_4_ = uVar2;
                      auVar257._8_4_ = uVar2;
                      auVar257._12_4_ = uVar2;
                      auVar160 = vfmadd132ps_fma(auVar257,auVar85._0_16_,pauVar48[2]);
                      uVar2 = puVar50[3];
                      auVar270._4_4_ = uVar2;
                      auVar270._0_4_ = uVar2;
                      auVar270._8_4_ = uVar2;
                      auVar270._12_4_ = uVar2;
                      auVar268 = vfmadd132ps_fma(auVar270,auVar206._0_16_,pauVar48[3]);
                      uVar2 = puVar50[lVar61];
                      auVar211._4_4_ = uVar2;
                      auVar211._0_4_ = uVar2;
                      auVar211._8_4_ = uVar2;
                      auVar211._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar211,auVar87,pauVar48[4]);
                      auVar209 = ZEXT1664(auVar87);
                      uVar2 = puVar50[lVar61 + 1];
                      auVar302._4_4_ = uVar2;
                      auVar302._0_4_ = uVar2;
                      auVar302._8_4_ = uVar2;
                      auVar302._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar302,auVar120,pauVar48[5]);
                      auVar300 = ZEXT1664(auVar87);
                      uVar2 = puVar50[lVar61 + 2];
                      auVar123._4_4_ = uVar2;
                      auVar123._0_4_ = uVar2;
                      auVar123._8_4_ = uVar2;
                      auVar123._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar123,auVar160,pauVar48[6]);
                      auVar85 = ZEXT1664(auVar87);
                      uVar2 = puVar50[lVar61 + 3];
                      auVar89._4_4_ = uVar2;
                      auVar89._0_4_ = uVar2;
                      auVar89._8_4_ = uVar2;
                      auVar89._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar89,auVar268,pauVar48[7]);
                      auVar206 = ZEXT1664(auVar87);
                      pauVar48 = pauVar48 + 8;
                      puVar50 = puVar50 + iVar5 * 4;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar41 = iVar4, 0 < iVar4)) {
                    do {
                      uVar2 = *puVar50;
                      auVar163._4_4_ = uVar2;
                      auVar163._0_4_ = uVar2;
                      auVar163._8_4_ = uVar2;
                      auVar163._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar163,auVar209._0_16_,*pauVar48);
                      uVar2 = puVar50[lVar61];
                      auVar239._4_4_ = uVar2;
                      auVar239._0_4_ = uVar2;
                      auVar239._8_4_ = uVar2;
                      auVar239._12_4_ = uVar2;
                      auVar120 = vfmadd132ps_fma(auVar239,auVar300._0_16_,pauVar48[1]);
                      uVar2 = puVar50[iVar22 * 2];
                      auVar258._4_4_ = uVar2;
                      auVar258._0_4_ = uVar2;
                      auVar258._8_4_ = uVar2;
                      auVar258._12_4_ = uVar2;
                      auVar160 = vfmadd132ps_fma(auVar258,auVar85._0_16_,pauVar48[2]);
                      uVar2 = puVar50[iVar22 * 3];
                      auVar271._4_4_ = uVar2;
                      auVar271._0_4_ = uVar2;
                      auVar271._8_4_ = uVar2;
                      auVar271._12_4_ = uVar2;
                      auVar268 = vfmadd132ps_fma(auVar271,auVar206._0_16_,pauVar48[3]);
                      uVar2 = puVar50[iVar22 * 4];
                      auVar212._4_4_ = uVar2;
                      auVar212._0_4_ = uVar2;
                      auVar212._8_4_ = uVar2;
                      auVar212._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar212,auVar87,pauVar48[4]);
                      auVar209 = ZEXT1664(auVar87);
                      uVar2 = puVar50[iVar22 * 5];
                      auVar303._4_4_ = uVar2;
                      auVar303._0_4_ = uVar2;
                      auVar303._8_4_ = uVar2;
                      auVar303._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar303,auVar120,pauVar48[5]);
                      auVar300 = ZEXT1664(auVar87);
                      uVar2 = puVar50[iVar22 * 6];
                      auVar124._4_4_ = uVar2;
                      auVar124._0_4_ = uVar2;
                      auVar124._8_4_ = uVar2;
                      auVar124._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar124,auVar160,pauVar48[6]);
                      auVar85 = ZEXT1664(auVar87);
                      uVar2 = puVar50[iVar22 * 7];
                      auVar90._4_4_ = uVar2;
                      auVar90._0_4_ = uVar2;
                      auVar90._8_4_ = uVar2;
                      auVar90._12_4_ = uVar2;
                      auVar87 = vfmadd132ps_fma(auVar90,auVar268,pauVar48[7]);
                      auVar206 = ZEXT1664(auVar87);
                      pauVar48 = pauVar48 + 8;
                      puVar50 = puVar50 + lVar26;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  iVar41 = iVar38 + 0xf;
                  uVar23 = uVar46 & 0xfffffff8;
                  iVar38 = iVar38 + 8;
                } while (iVar41 < (int)uVar46);
              }
              auVar120 = auVar85._0_16_;
              auVar87 = auVar206._0_16_;
              if ((int)(uVar23 | 3) < (int)uVar46) {
                uVar49 = uVar23;
                do {
                  lVar28 = (long)((int)uVar49 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  puVar50 = (undefined4 *)
                            ((long)(_func_int ***)local_d8.data +
                            lVar28 + (long)(local_d8.elempack * iVar45 * (int)local_1d8) * 4);
                  if ((local_d8.elempack == 4) && (0 < iVar4)) {
                    puVar50 = (undefined4 *)
                              ((long)(_func_int ***)local_d8.data + lVar28 + (long)iVar39 * 4);
                    iVar38 = iVar4;
                    do {
                      uVar2 = *puVar50;
                      auVar164._4_4_ = uVar2;
                      auVar164._0_4_ = uVar2;
                      auVar164._8_4_ = uVar2;
                      auVar164._12_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar209._0_16_,auVar164,*pauVar48);
                      auVar209 = ZEXT1664(auVar87);
                      uVar2 = puVar50[1];
                      auVar165._4_4_ = uVar2;
                      auVar165._0_4_ = uVar2;
                      auVar165._8_4_ = uVar2;
                      auVar165._12_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar300._0_16_,auVar165,pauVar48[1]);
                      auVar300 = ZEXT1664(auVar87);
                      uVar2 = puVar50[2];
                      auVar166._4_4_ = uVar2;
                      auVar166._0_4_ = uVar2;
                      auVar166._8_4_ = uVar2;
                      auVar166._12_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar85._0_16_,auVar166,pauVar48[2]);
                      auVar85 = ZEXT1664(auVar87);
                      uVar2 = puVar50[3];
                      auVar167._4_4_ = uVar2;
                      auVar167._0_4_ = uVar2;
                      auVar167._8_4_ = uVar2;
                      auVar167._12_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar206._0_16_,auVar167,pauVar48[3]);
                      auVar206 = ZEXT1664(auVar87);
                      pauVar48 = pauVar48 + 4;
                      puVar50 = puVar50 + iVar5 * 4;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar38 = iVar4, 0 < iVar4)) {
                    do {
                      uVar2 = *puVar50;
                      auVar168._4_4_ = uVar2;
                      auVar168._0_4_ = uVar2;
                      auVar168._8_4_ = uVar2;
                      auVar168._12_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar209._0_16_,auVar168,*pauVar48);
                      auVar209 = ZEXT1664(auVar87);
                      uVar2 = puVar50[lVar61];
                      auVar169._4_4_ = uVar2;
                      auVar169._0_4_ = uVar2;
                      auVar169._8_4_ = uVar2;
                      auVar169._12_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar300._0_16_,auVar169,pauVar48[1]);
                      auVar300 = ZEXT1664(auVar87);
                      uVar2 = puVar50[iVar22 * 2];
                      auVar170._4_4_ = uVar2;
                      auVar170._0_4_ = uVar2;
                      auVar170._8_4_ = uVar2;
                      auVar170._12_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar85._0_16_,auVar170,pauVar48[2]);
                      auVar85 = ZEXT1664(auVar87);
                      uVar2 = puVar50[iVar22 * 3];
                      auVar171._4_4_ = uVar2;
                      auVar171._0_4_ = uVar2;
                      auVar171._8_4_ = uVar2;
                      auVar171._12_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar206._0_16_,auVar171,pauVar48[3]);
                      auVar206 = ZEXT1664(auVar87);
                      pauVar48 = pauVar48 + 4;
                      puVar50 = puVar50 + lVar26;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  auVar120 = auVar85._0_16_;
                  auVar87 = auVar206._0_16_;
                  uVar23 = uVar49 + 4;
                  iVar38 = uVar49 + 7;
                  uVar49 = uVar23;
                } while (iVar38 < (int)uVar46);
              }
              auVar160 = auVar300._0_16_;
              uVar30 = (ulong)uVar23;
              if ((int)(uVar23 | 1) < (int)uVar46) {
                lVar28 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                lVar33 = lVar28 * uVar30;
                lVar34 = (long)(_func_int ***)local_d8.data + lVar33 + (long)local_198;
                lVar28 = lVar28 * 2;
                lVar33 = (long)(_func_int ***)local_d8.data + lVar33 + local_1c8;
                do {
                  if (0 < iVar4) {
                    lVar59 = 0;
                    iVar38 = iVar4;
                    do {
                      uVar2 = *(undefined4 *)(lVar33 + lVar59);
                      auVar172._4_4_ = uVar2;
                      auVar172._0_4_ = uVar2;
                      auVar172._8_4_ = uVar2;
                      auVar172._12_4_ = uVar2;
                      auVar160 = vfmadd231ps_fma(auVar209._0_16_,auVar172,*pauVar48);
                      auVar209 = ZEXT1664(auVar160);
                      uVar2 = *(undefined4 *)(lVar34 + lVar59);
                      auVar173._4_4_ = uVar2;
                      auVar173._0_4_ = uVar2;
                      auVar173._8_4_ = uVar2;
                      auVar173._12_4_ = uVar2;
                      auVar160 = vfmadd231ps_fma(auVar300._0_16_,auVar173,pauVar48[1]);
                      auVar300 = ZEXT1664(auVar160);
                      pauVar48 = pauVar48 + 2;
                      lVar59 = lVar59 + lVar26 * 4;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  auVar160 = auVar300._0_16_;
                  uVar30 = uVar30 + 2;
                  uVar23 = (uint)uVar30;
                  lVar34 = lVar34 + lVar28;
                  lVar33 = lVar33 + lVar28;
                } while ((int)(uVar23 | 1) < (int)uVar46);
              }
              auVar268 = auVar209._0_16_;
              if ((int)uVar23 < (int)uVar46) {
                lVar28 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                uVar30 = (ulong)uVar23;
                puVar50 = (undefined4 *)
                          ((long)(_func_int ***)local_d8.data + lVar28 * uVar30 + local_1c8);
                do {
                  puVar35 = puVar50;
                  iVar38 = iVar4;
                  if (0 < iVar4) {
                    do {
                      uVar2 = *puVar35;
                      auVar174._4_4_ = uVar2;
                      auVar174._0_4_ = uVar2;
                      auVar174._8_4_ = uVar2;
                      auVar174._12_4_ = uVar2;
                      auVar268 = vfmadd231ps_fma(auVar209._0_16_,auVar174,*pauVar48);
                      auVar209 = ZEXT1664(auVar268);
                      pauVar48 = pauVar48 + 1;
                      puVar35 = puVar35 + lVar26;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  auVar268 = auVar209._0_16_;
                  uVar30 = uVar30 + 1;
                  puVar50 = (undefined4 *)((long)puVar50 + lVar28);
                } while ((int)uVar30 < (int)uVar46);
              }
              auVar91._0_4_ = auVar120._0_4_ + auVar87._0_4_ + auVar160._0_4_ + auVar268._0_4_;
              auVar91._4_4_ = auVar120._4_4_ + auVar87._4_4_ + auVar160._4_4_ + auVar268._4_4_;
              auVar91._8_4_ = auVar120._8_4_ + auVar87._8_4_ + auVar160._8_4_ + auVar268._8_4_;
              auVar91._12_4_ = auVar120._12_4_ + auVar87._12_4_ + auVar160._12_4_ + auVar268._12_4_;
              auVar87 = auVar203._0_16_;
              switch(uVar32) {
              case 1:
                auVar91 = vmaxps_avx(auVar87,auVar91);
                break;
              case 2:
                auVar120 = vmaxps_avx(auVar87,auVar91);
                auVar87 = vminps_avx(auVar87,auVar91);
                uVar2 = *(this->super_Convolution1D).activation_params.data;
                auVar94._4_4_ = uVar2;
                auVar94._0_4_ = uVar2;
                auVar94._8_4_ = uVar2;
                auVar94._12_4_ = uVar2;
                auVar91 = vfmadd213ps_fma(auVar94,auVar87,auVar120);
                break;
              case 3:
                puVar50 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
                uVar2 = *puVar50;
                auVar127._4_4_ = uVar2;
                auVar127._0_4_ = uVar2;
                auVar127._8_4_ = uVar2;
                auVar127._12_4_ = uVar2;
                uVar2 = puVar50[1];
                auVar181._4_4_ = uVar2;
                auVar181._0_4_ = uVar2;
                auVar181._8_4_ = uVar2;
                auVar181._12_4_ = uVar2;
                auVar87 = vmaxps_avx(auVar91,auVar127);
                auVar91 = vminps_avx(auVar87,auVar181);
                break;
              case 4:
                uVar30 = CONCAT44(auVar91._4_4_,auVar91._0_4_);
                auVar92._0_8_ = uVar30 ^ 0x8000000080000000;
                auVar92._8_4_ = -auVar91._8_4_;
                auVar92._12_4_ = -auVar91._12_4_;
                auVar128._8_4_ = 0x42b0c0a5;
                auVar128._0_8_ = 0x42b0c0a542b0c0a5;
                auVar128._12_4_ = 0x42b0c0a5;
                auVar87 = vminps_avx(auVar92,auVar128);
                auVar129._8_4_ = 0xc2b0c0a5;
                auVar129._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar129._12_4_ = 0xc2b0c0a5;
                auVar160 = vmaxps_avx(auVar87,auVar129);
                auVar130._8_4_ = 0x3fb8aa3b;
                auVar130._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar130._12_4_ = 0x3fb8aa3b;
                auVar87 = vfmadd213ps_fma(auVar130,auVar160,auVar202);
                auVar182._0_4_ = (int)auVar87._0_4_;
                auVar182._4_4_ = (int)auVar87._4_4_;
                auVar182._8_4_ = (int)auVar87._8_4_;
                auVar182._12_4_ = (int)auVar87._12_4_;
                auVar120 = vcvtdq2ps_avx(auVar182);
                auVar87 = vcmpps_avx(auVar87,auVar120,1);
                auVar87 = vandps_avx(auVar87,auVar204);
                auVar87 = vsubps_avx(auVar120,auVar87);
                auVar70._8_4_ = 0x3f318000;
                auVar70._0_8_ = 0x3f3180003f318000;
                auVar70._12_4_ = 0x3f318000;
                auVar120 = vfmsub231ps_fma(auVar160,auVar87,auVar70);
                auVar183._8_4_ = 0x395e8083;
                auVar183._0_8_ = 0x395e8083395e8083;
                auVar183._12_4_ = 0x395e8083;
                auVar160 = vfmsub231ps_fma(auVar120,auVar87,auVar183);
                auVar184._0_4_ = auVar160._0_4_ * auVar160._0_4_;
                auVar184._4_4_ = auVar160._4_4_ * auVar160._4_4_;
                auVar184._8_4_ = auVar160._8_4_ * auVar160._8_4_;
                auVar184._12_4_ = auVar160._12_4_ * auVar160._12_4_;
                auVar219._8_4_ = 0x39506967;
                auVar219._0_8_ = 0x3950696739506967;
                auVar219._12_4_ = 0x39506967;
                auVar246._8_4_ = 0x3ab743ce;
                auVar246._0_8_ = 0x3ab743ce3ab743ce;
                auVar246._12_4_ = 0x3ab743ce;
                auVar120 = vfmadd213ps_fma(auVar219,auVar160,auVar246);
                auVar195._8_4_ = 0x3c088908;
                auVar195._0_8_ = 0x3c0889083c088908;
                auVar195._12_4_ = 0x3c088908;
                auVar120 = vfmadd213ps_fma(auVar120,auVar160,auVar195);
                auVar71._8_4_ = 0x3d2aa9c1;
                auVar71._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar71._12_4_ = 0x3d2aa9c1;
                auVar120 = vfmadd213ps_fma(auVar120,auVar160,auVar71);
                auVar72._8_4_ = 0x3e2aaaaa;
                auVar72._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar72._12_4_ = 0x3e2aaaaa;
                auVar120 = vfmadd213ps_fma(auVar120,auVar160,auVar72);
                auVar120 = vfmadd213ps_fma(auVar120,auVar160,auVar202);
                auVar120 = vfmadd213ps_fma(auVar120,auVar184,auVar160);
                auVar93._0_4_ = auVar120._0_4_ + 1.0;
                auVar93._4_4_ = auVar120._4_4_ + 1.0;
                auVar93._8_4_ = auVar120._8_4_ + 1.0;
                auVar93._12_4_ = auVar120._12_4_ + 1.0;
                auVar131._0_4_ = (int)auVar87._0_4_;
                auVar131._4_4_ = (int)auVar87._4_4_;
                auVar131._8_4_ = (int)auVar87._8_4_;
                auVar131._12_4_ = (int)auVar87._12_4_;
                auVar87 = vpslld_avx(auVar131,0x17);
                auVar87 = vpaddd_avx(auVar87,auVar204);
                auVar87 = vfmadd213ps_fma(auVar87,auVar93,auVar204);
                auVar91 = vdivps_avx(auVar204,auVar87);
                break;
              case 5:
                auVar304._8_4_ = 0x42b0c0a5;
                auVar304._0_8_ = 0x42b0c0a542b0c0a5;
                auVar304._12_4_ = 0x42b0c0a5;
                auVar87 = vminps_avx(auVar304,auVar91);
                auVar160 = vmaxps_avx(auVar292,auVar87);
                auVar175._8_4_ = 0x3fb8aa3b;
                auVar175._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar175._12_4_ = 0x3fb8aa3b;
                auVar87 = vfmadd213ps_fma(auVar175,auVar160,auVar202);
                auVar213._0_4_ = (int)auVar87._0_4_;
                auVar213._4_4_ = (int)auVar87._4_4_;
                auVar213._8_4_ = (int)auVar87._8_4_;
                auVar213._12_4_ = (int)auVar87._12_4_;
                auVar120 = vcvtdq2ps_avx(auVar213);
                auVar87 = vcmpps_avx(auVar87,auVar120,1);
                auVar87 = vandps_avx(auVar87,auVar204);
                auVar87 = vsubps_avx(auVar120,auVar87);
                auVar67._8_4_ = 0x3f318000;
                auVar67._0_8_ = 0x3f3180003f318000;
                auVar67._12_4_ = 0x3f318000;
                auVar120 = vfmsub231ps_fma(auVar160,auVar87,auVar67);
                auVar249._8_4_ = 0xb95e8083;
                auVar249._0_8_ = 0xb95e8083b95e8083;
                auVar249._12_4_ = 0xb95e8083;
                auVar160 = vfnmsub231ps_fma(auVar120,auVar87,auVar249);
                auVar214._0_4_ = auVar160._0_4_ * auVar160._0_4_;
                auVar214._4_4_ = auVar160._4_4_ * auVar160._4_4_;
                auVar214._8_4_ = auVar160._8_4_ * auVar160._8_4_;
                auVar214._12_4_ = auVar160._12_4_ * auVar160._12_4_;
                auVar240._8_4_ = 0x39506967;
                auVar240._0_8_ = 0x3950696739506967;
                auVar240._12_4_ = 0x39506967;
                auVar120 = vfmadd213ps_fma(auVar240,auVar160,auVar295);
                auVar193._8_4_ = 0x3c088908;
                auVar193._0_8_ = 0x3c0889083c088908;
                auVar193._12_4_ = 0x3c088908;
                auVar120 = vfmadd213ps_fma(auVar120,auVar160,auVar193);
                auVar194._8_4_ = 0x3d2aa9c1;
                auVar194._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar194._12_4_ = 0x3d2aa9c1;
                auVar120 = vfmadd213ps_fma(auVar120,auVar160,auVar194);
                auVar120 = vfmadd213ps_fma(auVar120,auVar160,auVar207);
                auVar120 = vfmadd213ps_fma(auVar120,auVar160,auVar202);
                auVar120 = vfmadd213ps_fma(auVar120,auVar214,auVar160);
                auVar215._0_4_ = auVar120._0_4_ + 1.0;
                auVar215._4_4_ = auVar120._4_4_ + 1.0;
                auVar215._8_4_ = auVar120._8_4_ + 1.0;
                auVar215._12_4_ = auVar120._12_4_ + 1.0;
                auVar125._0_4_ = (int)auVar87._0_4_;
                auVar125._4_4_ = (int)auVar87._4_4_;
                auVar125._8_4_ = (int)auVar87._8_4_;
                auVar125._12_4_ = (int)auVar87._12_4_;
                auVar87 = vpslld_avx(auVar125,0x17);
                auVar87 = vpaddd_avx(auVar87,auVar204);
                auVar66 = vfmadd213ps_fma(auVar87,auVar215,auVar204);
                auVar176._8_4_ = 0x800000;
                auVar176._0_8_ = 0x80000000800000;
                auVar176._12_4_ = 0x800000;
                auVar87 = vmaxps_avx(auVar66,auVar176);
                auVar120 = vpsrld_avx(auVar87,0x17);
                auVar241._8_4_ = 0xffffff82;
                auVar241._0_8_ = 0xffffff82ffffff82;
                auVar241._12_4_ = 0xffffff82;
                auVar120 = vpaddd_avx(auVar120,auVar241);
                auVar242._8_4_ = 0x807fffff;
                auVar242._0_8_ = 0x807fffff807fffff;
                auVar242._12_4_ = 0x807fffff;
                auVar87 = vandps_avx(auVar242,auVar87);
                auVar268 = vorps_avx(auVar87,auVar202);
                auVar160 = vcvtdq2ps_avx(auVar120);
                auVar243._8_4_ = 0x3f3504f3;
                auVar243._0_8_ = 0x3f3504f33f3504f3;
                auVar243._12_4_ = 0x3f3504f3;
                auVar120 = vcmpps_avx(auVar268,auVar243,1);
                auVar87 = vandps_avx(auVar120,auVar268);
                auVar177._0_4_ = auVar87._0_4_ + auVar268._0_4_ + -1.0;
                auVar177._4_4_ = auVar87._4_4_ + auVar268._4_4_ + -1.0;
                auVar177._8_4_ = auVar87._8_4_ + auVar268._8_4_ + -1.0;
                auVar177._12_4_ = auVar87._12_4_ + auVar268._12_4_ + -1.0;
                auVar87 = vandps_avx(auVar120,auVar204);
                auVar120 = vsubps_avx(auVar160,auVar87);
                auVar244._0_4_ = auVar177._0_4_ * auVar177._0_4_;
                auVar244._4_4_ = auVar177._4_4_ * auVar177._4_4_;
                auVar244._8_4_ = auVar177._8_4_ * auVar177._8_4_;
                auVar244._12_4_ = auVar177._12_4_ * auVar177._12_4_;
                auVar259._8_4_ = 0x3d9021bb;
                auVar259._0_8_ = 0x3d9021bb3d9021bb;
                auVar259._12_4_ = 0x3d9021bb;
                auVar272._8_4_ = 0xbdebd1b8;
                auVar272._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar272._12_4_ = 0xbdebd1b8;
                auVar87 = vfmadd213ps_fma(auVar259,auVar177,auVar272);
                auVar273._8_4_ = 0x3def251a;
                auVar273._0_8_ = 0x3def251a3def251a;
                auVar273._12_4_ = 0x3def251a;
                auVar87 = vfmadd213ps_fma(auVar87,auVar177,auVar273);
                auVar274._8_4_ = 0xbdfe5d4f;
                auVar274._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar274._12_4_ = 0xbdfe5d4f;
                auVar87 = vfmadd213ps_fma(auVar87,auVar177,auVar274);
                auVar275._8_4_ = 0x3e11e9bf;
                auVar275._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar275._12_4_ = 0x3e11e9bf;
                auVar87 = vfmadd213ps_fma(auVar87,auVar177,auVar275);
                auVar276._8_4_ = 0xbe2aae50;
                auVar276._0_8_ = 0xbe2aae50be2aae50;
                auVar276._12_4_ = 0xbe2aae50;
                auVar87 = vfmadd213ps_fma(auVar87,auVar177,auVar276);
                auVar277._8_4_ = 0x3e4cceac;
                auVar277._0_8_ = 0x3e4cceac3e4cceac;
                auVar277._12_4_ = 0x3e4cceac;
                auVar87 = vfmadd213ps_fma(auVar87,auVar177,auVar277);
                auVar278._8_4_ = 0xbe7ffffc;
                auVar278._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar278._12_4_ = 0xbe7ffffc;
                auVar87 = vfmadd213ps_fma(auVar87,auVar177,auVar278);
                auVar279._8_4_ = 0x3eaaaaaa;
                auVar279._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar279._12_4_ = 0x3eaaaaaa;
                auVar87 = vfmadd213ps_fma(auVar87,auVar177,auVar279);
                auVar260._0_4_ = auVar244._0_4_ * auVar177._0_4_ * auVar87._0_4_;
                auVar260._4_4_ = auVar244._4_4_ * auVar177._4_4_ * auVar87._4_4_;
                auVar260._8_4_ = auVar244._8_4_ * auVar177._8_4_ * auVar87._8_4_;
                auVar260._12_4_ = auVar244._12_4_ * auVar177._12_4_ * auVar87._12_4_;
                auVar87 = vfmadd231ps_fma(auVar260,auVar120,auVar249);
                auVar160 = vfmsub231ps_fma(auVar87,auVar202,auVar244);
                auVar87 = vcmpps_avx(auVar66,_DAT_005f1060,2);
                auVar160 = vsubps_avx(auVar160,auVar177);
                auVar120 = vfnmadd231ps_fma(auVar160,auVar67,auVar120);
                auVar178._0_4_ = auVar120._0_4_ + auVar120._0_4_;
                auVar178._4_4_ = auVar120._4_4_ + auVar120._4_4_;
                auVar178._8_4_ = auVar120._8_4_ + auVar120._8_4_;
                auVar178._12_4_ = auVar120._12_4_ + auVar120._12_4_;
                auVar216._8_4_ = 0x7fffffff;
                auVar216._0_8_ = 0x7fffffff7fffffff;
                auVar216._12_4_ = 0x7fffffff;
                auVar87 = vblendvps_avx(auVar178,auVar216,auVar87);
                auVar87 = vminps_avx(auVar304,auVar87);
                auVar160 = vmaxps_avx(auVar292,auVar87);
                auVar179._8_4_ = 0x3fb8aa3b;
                auVar179._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar179._12_4_ = 0x3fb8aa3b;
                auVar87 = vfmadd213ps_fma(auVar179,auVar160,auVar202);
                auVar217._0_4_ = (int)auVar87._0_4_;
                auVar217._4_4_ = (int)auVar87._4_4_;
                auVar217._8_4_ = (int)auVar87._8_4_;
                auVar217._12_4_ = (int)auVar87._12_4_;
                auVar120 = vcvtdq2ps_avx(auVar217);
                auVar87 = vcmpps_avx(auVar87,auVar120,1);
                auVar87 = vandps_avx(auVar87,auVar204);
                auVar87 = vsubps_avx(auVar120,auVar87);
                auVar120 = vfmsub231ps_fma(auVar160,auVar87,auVar67);
                auVar160 = vfnmsub231ps_fma(auVar120,auVar87,auVar249);
                auVar218._0_4_ = auVar160._0_4_ * auVar160._0_4_;
                auVar218._4_4_ = auVar160._4_4_ * auVar160._4_4_;
                auVar218._8_4_ = auVar160._8_4_ * auVar160._8_4_;
                auVar218._12_4_ = auVar160._12_4_ * auVar160._12_4_;
                auVar245._8_4_ = 0x39506967;
                auVar245._0_8_ = 0x3950696739506967;
                auVar245._12_4_ = 0x39506967;
                auVar203 = ZEXT864(0);
                auVar120 = vfmadd213ps_fma(auVar245,auVar160,auVar295);
                auVar68._8_4_ = 0x3c088908;
                auVar68._0_8_ = 0x3c0889083c088908;
                auVar68._12_4_ = 0x3c088908;
                auVar120 = vfmadd213ps_fma(auVar120,auVar160,auVar68);
                auVar120 = vfmadd213ps_fma(auVar120,auVar160,auVar194);
                auVar120 = vfmadd213ps_fma(auVar120,auVar160,auVar207);
                auVar120 = vfmadd213ps_fma(auVar120,auVar160,auVar202);
                auVar120 = vfmadd213ps_fma(auVar120,auVar218,auVar160);
                auVar126._0_4_ = auVar120._0_4_ + 1.0;
                auVar126._4_4_ = auVar120._4_4_ + 1.0;
                auVar126._8_4_ = auVar120._8_4_ + 1.0;
                auVar126._12_4_ = auVar120._12_4_ + 1.0;
                auVar180._0_4_ = (int)auVar87._0_4_;
                auVar180._4_4_ = (int)auVar87._4_4_;
                auVar180._8_4_ = (int)auVar87._8_4_;
                auVar180._12_4_ = (int)auVar87._12_4_;
                auVar87 = vpslld_avx(auVar180,0x17);
                auVar87 = vpaddd_avx(auVar87,auVar204);
                auVar87 = vfmadd213ps_fma(auVar87,auVar126,auVar204);
                auVar69._8_4_ = 0x40000000;
                auVar69._0_8_ = 0x4000000040000000;
                auVar69._12_4_ = 0x40000000;
                auVar87 = vdivps_avx(auVar69,auVar87);
                auVar91 = vfmsub231ps_fma(auVar91,auVar91,auVar87);
                break;
              case 6:
                puVar50 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
                uVar2 = *puVar50;
                auVar132._4_4_ = uVar2;
                auVar132._0_4_ = uVar2;
                auVar132._8_4_ = uVar2;
                auVar132._12_4_ = uVar2;
                uVar2 = puVar50[1];
                auVar185._4_4_ = uVar2;
                auVar185._0_4_ = uVar2;
                auVar185._8_4_ = uVar2;
                auVar185._12_4_ = uVar2;
                auVar120 = vfmadd231ps_fma(auVar185,auVar91,auVar132);
                auVar87 = vmaxps_avx(auVar87,auVar120);
                auVar87 = vminps_avx(auVar87,auVar204);
                auVar91._0_4_ = auVar87._0_4_ * auVar91._0_4_;
                auVar91._4_4_ = auVar87._4_4_ * auVar91._4_4_;
                auVar91._8_4_ = auVar87._8_4_ * auVar91._8_4_;
                auVar91._12_4_ = auVar87._12_4_ * auVar91._12_4_;
              }
              if (iVar40 == 4) {
                *(undefined1 (*) [16])local_1c0 = auVar91;
                local_1c0 = (undefined1 (*) [32])((long)local_1c0 + 0x10);
              }
              if (iVar40 == 1) {
                *(int *)*local_1c0 = auVar91._0_4_;
                uVar2 = vextractps_avx(auVar91,1);
                *(undefined4 *)((long)*local_1c0 + (long)iVar25 * 4) = uVar2;
                uVar2 = vextractps_avx(auVar91,2);
                *(undefined4 *)((long)*local_1c0 + (long)(iVar25 * 2) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar91,3);
                *(undefined4 *)((long)*local_1c0 + (long)(iVar25 * 3) * 4) = uVar2;
                local_1c0 = (undefined1 (*) [32])((long)*local_1c0 + 4);
              }
              local_1d8 = local_1d8 + 1;
              iVar39 = iVar39 + iVar45 * local_d8.elempack;
              local_198 = (Allocator *)((long)local_198 + lVar27 * 4);
              local_1c8 = local_1c8 + lVar27 * 4;
            } while (local_1d8 != lVar54);
          }
          local_148 = local_148 + 1;
        } while (local_148 != (uint)(iVar56 >> 2));
      }
      uVar32 = uVar37 * 8 + (iVar56 >> 2) * 4;
      local_68 = (ulong)uVar32;
      local_70 = (ulong)(uint)((int)(iVar24 - uVar32) / 2);
      if (1 < (int)(iVar24 - uVar32)) {
        iVar56 = local_d8.h * local_d8.elempack;
        uVar37 = top_blob->w;
        lVar28 = (long)(int)uVar37 * top_blob->elemsize;
        iVar24 = local_d8.elempack * iVar45;
        local_38 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
        bVar62 = local_d8.elempack == 1;
        local_90 = CONCAT44(local_90._4_4_,iVar56) & 0xfffffffffffffff8;
        iVar25 = local_d8.elempack * iVar45;
        lVar33 = (long)(iVar5 * 4) * 4;
        local_40 = top_blob->data;
        local_48 = (this->weight_data_tm).data;
        local_50 = (long)(int)uVar32;
        lVar54 = lVar26 * 4;
        local_58 = lVar61 * 4;
        local_140 = 0;
        local_78 = local_70;
        do {
          pvVar8 = local_d8.data;
          if (0 < (int)uVar37) {
            lVar34 = local_50 + local_140 * 2;
            pfVar55 = (float *)((local_50 + local_140 * 2 + 1) * lVar28 + (long)local_40);
            pfVar60 = (float *)(lVar34 * lVar28 + (long)local_40);
            uVar32 = (uint)lVar34;
            uVar46 = uVar32 + 3;
            uVar58 = uVar32 + 7;
            if (-1 < (int)uVar32) {
              uVar46 = uVar32;
              uVar58 = uVar32;
            }
            iVar39 = uVar32 - (uVar58 & 0xfffffff8);
            iVar40 = (uVar32 - (uVar58 & 0xfffffff8)) + 3;
            if (-1 < iVar39) {
              iVar40 = iVar39;
            }
            pauVar47 = (undefined1 (*) [32])
                       ((((int)(uVar32 - (uVar46 & 0xfffffffc)) >> 1) + ((int)uVar58 >> 3) +
                        (iVar40 >> 2)) * local_38 + (long)local_48);
            lVar59 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
            pfVar7 = (float *)(this->super_Convolution1D).activation_params.data;
            local_128 = (long)(_func_int ***)local_d8.data + local_58;
            iVar40 = 0;
            local_158 = (Allocator *)local_d8.data;
            local_200 = 0;
            do {
              if (pvVar6 == (void *)0x0) {
                fVar64 = 0.0;
                fVar65 = 0.0;
              }
              else {
                pfVar1 = (float *)((long)pvVar6 + lVar34 * 4);
                fVar64 = *pfVar1;
                fVar65 = pfVar1[1];
              }
              pvVar42 = (void *)((long)iVar40 * 4);
              pauVar51 = pauVar47;
              if (iVar56 < 8) {
                uVar32 = 0;
                auVar76 = SUB6432(ZEXT864(0),0);
                auVar305 = SUB6432(ZEXT864(0),0);
              }
              else {
                auVar203 = ZEXT864(0);
                auVar206 = ZEXT864(0);
                iVar39 = 0;
                do {
                  lVar57 = (iVar39 / iVar3) * lVar59;
                  pauVar31 = (undefined1 (*) [32])
                             ((long)(_func_int ***)pvVar8 +
                             lVar57 + (long)(iVar24 * (int)local_200) * 4);
                  if ((iVar3 == 8) && (0 < iVar4)) {
                    pauVar31 = (undefined1 (*) [32])
                               ((long)(_func_int ***)pvVar8 + (long)(lVar57 + (long)pvVar42));
                    iVar38 = iVar4;
                    do {
                      auVar87 = vfmadd231ps_fma(auVar206._0_32_,*pauVar31,*pauVar51);
                      auVar206 = ZEXT1664(auVar87);
                      auVar87 = vfmadd231ps_fma(auVar203._0_32_,*pauVar31,pauVar51[1]);
                      auVar203 = ZEXT1664(auVar87);
                      pauVar51 = pauVar51 + 2;
                      pauVar31 = (undefined1 (*) [32])(*pauVar31 + (long)(iVar5 * 8) * 4);
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  if ((iVar3 == 4) && (iVar38 = iVar4, 0 < iVar4)) {
                    do {
                      auVar190._16_16_ = *(undefined1 (*) [16])(*pauVar31 + lVar61 * 4);
                      auVar190._0_16_ = *(undefined1 (*) [16])*pauVar31;
                      auVar87 = vfmadd231ps_fma(auVar206._0_32_,auVar190,*pauVar51);
                      auVar206 = ZEXT1664(auVar87);
                      auVar87 = vfmadd231ps_fma(auVar203._0_32_,auVar190,pauVar51[1]);
                      auVar203 = ZEXT1664(auVar87);
                      pauVar51 = pauVar51 + 2;
                      pauVar31 = (undefined1 (*) [32])(*pauVar31 + lVar33);
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  iVar38 = iVar4;
                  if (0 < iVar4 && bVar62) {
                    do {
                      auVar87 = vinsertps_avx(ZEXT416(*(uint *)*pauVar31),
                                              ZEXT416(*(uint *)(*pauVar31 + lVar61 * 4)),0x10);
                      auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(*pauVar31 +
                                                                       (long)(iVar22 * 2) * 4)),0x20
                                             );
                      auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(*pauVar31 +
                                                                       (long)(iVar22 * 3) * 4)),0x30
                                             );
                      auVar120 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar31 + (long)(iVar22 * 4) * 4)
                                                      ),ZEXT416(*(uint *)(*pauVar31 +
                                                                         (long)(iVar22 * 5) * 4)),
                                               0x10);
                      auVar120 = vinsertps_avx(auVar120,ZEXT416(*(uint *)(*pauVar31 +
                                                                         (long)(iVar22 * 6) * 4)),
                                               0x20);
                      auVar120 = vinsertps_avx(auVar120,ZEXT416(*(uint *)(*pauVar31 +
                                                                         (long)(iVar22 * 7) * 4)),
                                               0x30);
                      auVar191._16_16_ = auVar120;
                      auVar191._0_16_ = auVar87;
                      auVar87 = vfmadd231ps_fma(auVar206._0_32_,auVar191,*pauVar51);
                      auVar206 = ZEXT1664(auVar87);
                      auVar87 = vfmadd231ps_fma(auVar203._0_32_,auVar191,pauVar51[1]);
                      auVar203 = ZEXT1664(auVar87);
                      pauVar51 = pauVar51 + 2;
                      pauVar31 = (undefined1 (*) [32])(*pauVar31 + lVar54);
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  auVar305 = auVar203._0_32_;
                  auVar76 = auVar206._0_32_;
                  iVar38 = iVar39 + 0xf;
                  iVar39 = iVar39 + 8;
                } while (iVar38 < iVar56);
                uVar32 = (uint)local_90;
              }
              auVar87 = ZEXT816(0) << 0x40;
              auVar203 = ZEXT1664(auVar87);
              if ((int)(uVar32 | 3) < iVar56) {
                pvVar42 = (void *)((long)(_func_int ***)pvVar8 + (long)pvVar42);
                auVar206 = ZEXT864(0);
                uVar58 = uVar32;
                do {
                  lVar57 = ((int)uVar58 / iVar3) * lVar59;
                  pauVar48 = (undefined1 (*) [16])
                             ((long)(_func_int ***)pvVar8 +
                             lVar57 + (long)(iVar24 * (int)local_200) * 4);
                  if ((iVar3 == 4) && (0 < iVar4)) {
                    pauVar48 = (undefined1 (*) [16])(lVar57 + (long)pvVar42);
                    iVar39 = iVar4;
                    do {
                      auVar87 = vfmadd231ps_fma(auVar203._0_16_,*pauVar48,
                                                *(undefined1 (*) [16])*pauVar51);
                      auVar203 = ZEXT1664(auVar87);
                      auVar87 = vfmadd231ps_fma(auVar206._0_16_,*pauVar48,
                                                *(undefined1 (*) [16])(*pauVar51 + 0x10));
                      auVar206 = ZEXT1664(auVar87);
                      pauVar51 = pauVar51 + 1;
                      pauVar48 = (undefined1 (*) [16])(*pauVar48 + lVar33);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  iVar39 = iVar4;
                  if (0 < iVar4 && bVar62) {
                    do {
                      auVar87 = vinsertps_avx(ZEXT416(*(uint *)*pauVar48),
                                              ZEXT416(*(uint *)(*pauVar48 + lVar61 * 4)),0x10);
                      auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(*pauVar48 +
                                                                       (long)(iVar22 * 2) * 4)),0x20
                                             );
                      auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(*pauVar48 +
                                                                       (long)(iVar22 * 3) * 4)),0x30
                                             );
                      auVar120 = vfmadd231ps_fma(auVar203._0_16_,auVar87,
                                                 *(undefined1 (*) [16])*pauVar51);
                      auVar203 = ZEXT1664(auVar120);
                      auVar87 = vfmadd231ps_fma(auVar206._0_16_,auVar87,
                                                *(undefined1 (*) [16])(*pauVar51 + 0x10));
                      auVar206 = ZEXT1664(auVar87);
                      pauVar51 = pauVar51 + 1;
                      pauVar48 = (undefined1 (*) [16])(*pauVar48 + lVar54);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar120 = auVar206._0_16_;
                  auVar87 = auVar203._0_16_;
                  uVar32 = uVar58 + 4;
                  iVar39 = uVar58 + 7;
                  uVar58 = uVar32;
                } while (iVar39 < iVar56);
              }
              else {
                auVar120 = SUB6416(ZEXT864(0),0);
              }
              local_118._0_8_ = pvVar42;
              uVar29 = (ulong)uVar32;
              auVar133._0_4_ = auVar76._16_4_ + auVar76._0_4_;
              auVar133._4_4_ = auVar76._20_4_ + auVar76._4_4_;
              auVar133._8_4_ = auVar76._24_4_ + auVar76._8_4_;
              auVar133._12_4_ = auVar76._28_4_ + auVar76._12_4_;
              auVar202 = vshufpd_avx(auVar133,auVar133,1);
              auVar134._0_4_ = auVar202._0_4_ + auVar133._0_4_;
              auVar134._4_4_ = auVar202._4_4_ + auVar133._4_4_;
              auVar134._8_4_ = auVar202._8_4_ + auVar133._8_4_;
              auVar134._12_4_ = auVar202._12_4_ + auVar133._12_4_;
              auVar95._0_4_ = auVar305._16_4_ + auVar305._0_4_;
              auVar95._4_4_ = auVar305._20_4_ + auVar305._4_4_;
              auVar95._8_4_ = auVar305._24_4_ + auVar305._8_4_;
              auVar95._12_4_ = auVar305._28_4_ + auVar305._12_4_;
              auVar202 = vshufpd_avx(auVar95,auVar95,1);
              auVar96._0_4_ = auVar202._0_4_ + auVar95._0_4_;
              auVar96._4_4_ = auVar202._4_4_ + auVar95._4_4_;
              auVar96._8_4_ = auVar202._8_4_ + auVar95._8_4_;
              auVar96._12_4_ = auVar202._12_4_ + auVar95._12_4_;
              auVar202 = vshufpd_avx(auVar87,auVar87,1);
              auVar196._0_4_ = auVar202._0_4_ + auVar87._0_4_;
              auVar196._4_4_ = auVar202._4_4_ + auVar87._4_4_;
              auVar196._8_4_ = auVar202._8_4_ + auVar87._8_4_;
              auVar196._12_4_ = auVar202._12_4_ + auVar87._12_4_;
              auVar87 = vinsertps_avx(auVar96,auVar134,0x4c);
              auVar202 = vshufpd_avx(auVar120,auVar120,1);
              auVar186._0_4_ = auVar202._0_4_ + auVar120._0_4_;
              auVar186._4_4_ = auVar202._4_4_ + auVar120._4_4_;
              auVar186._8_4_ = auVar202._8_4_ + auVar120._8_4_;
              auVar186._12_4_ = auVar202._12_4_ + auVar120._12_4_;
              auVar120 = vinsertps_avx(auVar134,auVar96,0x1c);
              auVar202 = vinsertps_avx(auVar186,auVar196,0x4c);
              auVar160 = vinsertps_avx(auVar196,auVar186,0x1c);
              auVar203 = ZEXT1664(CONCAT412(auVar87._12_4_ + 0.0 + auVar120._12_4_ + auVar202._12_4_
                                            + auVar160._12_4_,
                                            CONCAT48(auVar87._8_4_ + 0.0 +
                                                     auVar120._8_4_ + auVar202._8_4_ +
                                                     auVar160._8_4_,
                                                     CONCAT44(auVar87._4_4_ + fVar65 +
                                                              auVar120._4_4_ + auVar202._4_4_ +
                                                              auVar160._4_4_,
                                                              auVar87._0_4_ + fVar64 +
                                                              auVar120._0_4_ + auVar202._0_4_ +
                                                              auVar160._0_4_))));
              if ((int)(uVar32 | 1) < iVar56) {
                lVar57 = local_128 + lVar59 * uVar29;
                ppp_Var36 = (_func_int ***)((long)&local_158->_vptr_Allocator + lVar59 * uVar29);
                do {
                  if (0 < iVar4) {
                    lVar52 = 0;
                    iVar39 = iVar4;
                    do {
                      uVar2 = *(undefined4 *)((long)ppp_Var36 + lVar52);
                      auVar73._4_4_ = uVar2;
                      auVar73._0_4_ = uVar2;
                      auVar73._8_4_ = uVar2;
                      auVar73._12_4_ = uVar2;
                      auVar97._8_8_ = 0;
                      auVar97._0_8_ = *(ulong *)*pauVar51;
                      auVar87 = vfmadd213ps_fma(auVar97,auVar73,auVar203._0_16_);
                      auVar74._8_8_ = 0;
                      auVar74._0_8_ = *(ulong *)(*pauVar51 + 8);
                      uVar2 = *(undefined4 *)(lVar57 + lVar52);
                      auVar197._4_4_ = uVar2;
                      auVar197._0_4_ = uVar2;
                      auVar197._8_4_ = uVar2;
                      auVar197._12_4_ = uVar2;
                      auVar87 = vfmadd213ps_fma(auVar197,auVar74,auVar87);
                      auVar203 = ZEXT1664(auVar87);
                      pauVar51 = (undefined1 (*) [32])(*pauVar51 + 0x10);
                      lVar52 = lVar52 + lVar54;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  uVar29 = uVar29 + 2;
                  uVar32 = (uint)uVar29;
                  lVar57 = lVar57 + lVar59 * 2;
                  ppp_Var36 = (_func_int ***)((long)ppp_Var36 + lVar59 * 2);
                } while ((int)(uVar32 | 1) < iVar56);
              }
              auVar87 = auVar203._0_16_;
              if ((int)uVar32 < iVar56) {
                uVar29 = (ulong)uVar32;
                ppp_Var36 = (_func_int ***)((long)&local_158->_vptr_Allocator + lVar59 * uVar29);
                do {
                  ppp_Var44 = ppp_Var36;
                  iVar39 = iVar4;
                  if (0 < iVar4) {
                    do {
                      auVar75._8_8_ = 0;
                      auVar75._0_8_ = *(ulong *)*pauVar51;
                      uVar2 = *(undefined4 *)ppp_Var44;
                      auVar98._4_4_ = uVar2;
                      auVar98._0_4_ = uVar2;
                      auVar98._8_4_ = uVar2;
                      auVar98._12_4_ = uVar2;
                      auVar87 = vfmadd231ps_fma(auVar203._0_16_,auVar75,auVar98);
                      auVar203 = ZEXT1664(auVar87);
                      pauVar51 = (undefined1 (*) [32])(*pauVar51 + 8);
                      ppp_Var44 = (_func_int ***)((long)ppp_Var44 + lVar54);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar87 = auVar203._0_16_;
                  uVar29 = uVar29 + 1;
                  ppp_Var36 = (_func_int ***)((long)ppp_Var36 + lVar59);
                } while ((int)uVar29 < iVar56);
              }
              iVar39 = (int)local_80 + -1;
              fVar65 = auVar87._0_4_;
              fVar64 = fVar65;
              switch(iVar39) {
              case 0:
                auVar120 = vmaxss_avx(auVar87,ZEXT416(0));
                fVar64 = auVar120._0_4_;
                break;
              case 1:
                auVar120 = vcmpss_avx(ZEXT816(0) << 0x40,auVar87,1);
                auVar136._8_4_ = 0x3f800000;
                auVar136._0_8_ = 0x3f8000003f800000;
                auVar136._12_4_ = 0x3f800000;
                auVar120 = vblendvps_avx(ZEXT416((uint)*pfVar7),auVar136,auVar120);
                fVar64 = auVar120._0_4_;
                goto LAB_005818ff;
              case 2:
                auVar120 = vmaxss_avx(auVar87,ZEXT416((uint)*pfVar7));
                fVar64 = auVar120._0_4_;
                if (pfVar7[1] < auVar120._0_4_) {
                  fVar64 = pfVar7[1];
                }
                break;
              case 3:
                auVar120 = vminss_avx(auVar87,ZEXT416(0x42b0c0a5));
                auVar99._0_8_ = auVar120._0_8_ ^ 0x8000000080000000;
                auVar99._8_4_ = auVar120._8_4_ ^ 0x80000000;
                auVar99._12_4_ = auVar120._12_4_ ^ 0x80000000;
                auVar120 = vcmpss_avx(auVar120,ZEXT416(0xc2b0c0a5),1);
                auVar135._8_4_ = 0x42b0c0a5;
                auVar135._0_8_ = 0x42b0c0a542b0c0a5;
                auVar135._12_4_ = 0x42b0c0a5;
                auVar120 = vblendvps_avx(auVar99,auVar135,auVar120);
                fVar64 = expf(auVar120._0_4_);
                fVar64 = 1.0 / (fVar64 + 1.0);
                break;
              case 4:
                fVar64 = expf(fVar65);
                fVar64 = logf(fVar64 + 1.0);
                fVar64 = tanhf(fVar64);
LAB_005818ff:
                fVar64 = fVar64 * fVar65;
                break;
              case 5:
                fVar192 = *pfVar7;
                fVar119 = -pfVar7[1] / fVar192;
                fVar64 = 0.0;
                if ((fVar119 <= fVar65) && (fVar64 = fVar65, fVar65 <= fVar119 + 1.0 / fVar192)) {
                  auVar120 = vfmadd213ss_fma(ZEXT416((uint)fVar192),auVar87,ZEXT416((uint)pfVar7[1])
                                            );
                  fVar64 = auVar120._0_4_;
                  goto LAB_005818ff;
                }
              }
              auVar87 = vmovshdup_avx(auVar87);
              fVar192 = auVar87._0_4_;
              fVar65 = fVar192;
              switch(iVar39) {
              case 0:
                auVar87 = vmaxss_avx(auVar87,ZEXT416(0));
                fVar65 = auVar87._0_4_;
                break;
              case 1:
                auVar87 = vcmpss_avx(ZEXT816(0) << 0x40,auVar87,1);
                auVar138._8_4_ = 0x3f800000;
                auVar138._0_8_ = 0x3f8000003f800000;
                auVar138._12_4_ = 0x3f800000;
                auVar87 = vblendvps_avx(ZEXT416((uint)*pfVar7),auVar138,auVar87);
                fVar65 = auVar87._0_4_ * fVar192;
                break;
              case 2:
                auVar87 = vmaxss_avx(auVar87,ZEXT416((uint)*pfVar7));
                fVar65 = auVar87._0_4_;
                if (pfVar7[1] < auVar87._0_4_) {
                  fVar65 = pfVar7[1];
                }
                break;
              case 3:
                auVar87 = vminss_avx(auVar87,ZEXT416(0x42b0c0a5));
                auVar100._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
                auVar100._8_4_ = auVar87._8_4_ ^ 0x80000000;
                auVar100._12_4_ = auVar87._12_4_ ^ 0x80000000;
                auVar87 = vcmpss_avx(auVar87,ZEXT416(0xc2b0c0a5),1);
                auVar137._8_4_ = 0x42b0c0a5;
                auVar137._0_8_ = 0x42b0c0a542b0c0a5;
                auVar137._12_4_ = 0x42b0c0a5;
                auVar87 = vblendvps_avx(auVar100,auVar137,auVar87);
                fVar65 = expf(auVar87._0_4_);
                fVar65 = 1.0 / (fVar65 + 1.0);
                break;
              case 4:
                fVar65 = expf(fVar192);
                fVar65 = logf(fVar65 + 1.0);
                fVar65 = tanhf(fVar65);
                local_118 = auVar87;
                fVar65 = fVar65 * fVar192;
                break;
              case 5:
                fVar119 = *pfVar7;
                fVar159 = -pfVar7[1] / fVar119;
                fVar65 = 0.0;
                if ((fVar159 <= fVar192) && (fVar65 = fVar192, fVar192 <= fVar159 + 1.0 / fVar119))
                {
                  auVar87 = vfmadd213ss_fma(ZEXT416((uint)fVar119),auVar87,ZEXT416((uint)pfVar7[1]))
                  ;
                  fVar65 = auVar87._0_4_ * fVar192;
                }
              }
              *pfVar60 = fVar64;
              *pfVar55 = fVar65;
              pfVar60 = pfVar60 + 1;
              pfVar55 = pfVar55 + 1;
              local_200 = local_200 + 1;
              iVar40 = iVar40 + iVar25;
              local_128 = local_128 + lVar27 * 4;
              local_158 = (Allocator *)((long)&local_158->_vptr_Allocator + lVar27 * 4);
            } while (local_200 != uVar37);
          }
          local_140 = local_140 + 1;
        } while (local_140 != local_78);
      }
      iVar24 = (int)local_68 + (int)local_70 * 2;
      if (iVar24 < (int)local_88) {
        pvVar8 = top_blob->data;
        iVar25 = top_blob->w;
        sVar9 = top_blob->elemsize;
        sVar10 = (this->weight_data_tm).elemsize;
        sVar11 = (this->weight_data_tm).cstep;
        bVar62 = 0 < iVar4;
        local_130 = uVar21 & 0xfffffff8;
        local_1a0 = (ulong)iVar24;
        lVar54 = (long)(iVar5 * 4) * 4;
        lVar26 = lVar26 * 4;
        pvVar42 = (this->weight_data_tm).data;
        do {
          pvVar20 = local_d8.data;
          if (0 < (int)local_60) {
            pfVar55 = (float *)((long)iVar25 * sVar9 * local_1a0 + (long)pvVar8);
            uVar32 = (uint)local_1a0;
            uVar58 = uVar32 + 3;
            uVar37 = uVar32 + 7;
            if (-1 < (int)uVar32) {
              uVar58 = uVar32;
              uVar37 = uVar32;
            }
            iVar56 = uVar32 - (uVar37 & 0xfffffff8);
            iVar24 = (uVar32 - (uVar37 & 0xfffffff8)) + 3;
            if (-1 < iVar56) {
              iVar24 = iVar56;
            }
            pauVar47 = (undefined1 (*) [32])
                       ((long)(int)((uVar32 - (((uint)(local_1a0 >> 0x1f) & 1) + uVar32 & 0xfffffffe
                                              )) + ((int)uVar37 >> 3) +
                                    (int)(uVar32 - (uVar58 & 0xfffffffc)) / 2 + (iVar24 >> 2)) *
                        sVar10 * sVar11 + (long)pvVar42);
            lVar28 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
            pfVar60 = (float *)(this->super_Convolution1D).activation_params.data;
            local_1b0 = (void *)((long)(_func_int ***)local_d8.data + lVar61 * 4);
            iVar24 = 0;
            local_198 = (Allocator *)local_d8.data;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = local_118._8_8_;
            local_118 = auVar19 << 0x40;
            do {
              if (pvVar6 == (void *)0x0) {
                fVar64 = 0.0;
              }
              else {
                fVar64 = *(float *)((long)pvVar6 + local_1a0 * 4);
              }
              pauVar51 = pauVar47;
              if ((int)uVar21 < 8) {
                auVar305 = SUB6432(ZEXT864(0),0);
                uVar32 = 0;
              }
              else {
                auVar203 = ZEXT864(0);
                iVar56 = 0;
                do {
                  lVar33 = (iVar56 / iVar3) * lVar28;
                  if (iVar3 == 8 && bVar62) {
                    pauVar31 = (undefined1 (*) [32])
                               ((long)(_func_int ***)pvVar20 + lVar33 + (long)iVar24 * 4);
                    iVar40 = iVar4;
                    do {
                      auVar87 = vfmadd231ps_fma(auVar203._0_32_,*pauVar31,*pauVar51);
                      auVar203 = ZEXT1664(auVar87);
                      pauVar51 = pauVar51 + 1;
                      pauVar31 = (undefined1 (*) [32])(*pauVar31 + (long)(iVar5 * 8) * 4);
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  else {
                    pauVar31 = (undefined1 (*) [32])
                               ((long)(_func_int ***)pvVar20 +
                               lVar33 + (long)(iVar3 * iVar45 * local_118._0_4_) * 4);
                  }
                  iVar40 = iVar4;
                  if (iVar3 == 4 && bVar62) {
                    do {
                      auVar156._16_16_ = *(undefined1 (*) [16])(*pauVar31 + lVar61 * 4);
                      auVar156._0_16_ = *(undefined1 (*) [16])*pauVar31;
                      auVar87 = vfmadd231ps_fma(auVar203._0_32_,auVar156,*pauVar51);
                      auVar203 = ZEXT1664(auVar87);
                      pauVar51 = pauVar51 + 1;
                      pauVar31 = (undefined1 (*) [32])(*pauVar31 + lVar54);
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  iVar40 = iVar4;
                  if (iVar3 == 1 && bVar62) {
                    do {
                      auVar87 = vinsertps_avx(ZEXT416(*(uint *)*pauVar31),
                                              ZEXT416(*(uint *)(*pauVar31 + lVar61 * 4)),0x10);
                      auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(*pauVar31 +
                                                                       (long)(iVar22 * 2) * 4)),0x20
                                             );
                      auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(*pauVar31 +
                                                                       (long)(iVar22 * 3) * 4)),0x30
                                             );
                      auVar120 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar31 + (long)(iVar22 * 4) * 4)
                                                      ),ZEXT416(*(uint *)(*pauVar31 +
                                                                         (long)(iVar22 * 5) * 4)),
                                               0x10);
                      auVar120 = vinsertps_avx(auVar120,ZEXT416(*(uint *)(*pauVar31 +
                                                                         (long)(iVar22 * 6) * 4)),
                                               0x20);
                      auVar120 = vinsertps_avx(auVar120,ZEXT416(*(uint *)(*pauVar31 +
                                                                         (long)(iVar22 * 7) * 4)),
                                               0x30);
                      auVar157._16_16_ = auVar120;
                      auVar157._0_16_ = auVar87;
                      auVar87 = vfmadd231ps_fma(auVar203._0_32_,auVar157,*pauVar51);
                      auVar203 = ZEXT1664(auVar87);
                      pauVar51 = pauVar51 + 1;
                      pauVar31 = (undefined1 (*) [32])(*pauVar31 + lVar26);
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  auVar305 = auVar203._0_32_;
                  iVar40 = iVar56 + 0xf;
                  iVar56 = iVar56 + 8;
                  uVar32 = local_130;
                } while (iVar40 < (int)uVar21);
              }
              auVar87 = ZEXT816(0) << 0x40;
              auVar203 = ZEXT1664(auVar87);
              if ((int)(uVar32 | 3) < (int)uVar21) {
                uVar37 = uVar32;
                do {
                  lVar33 = ((int)uVar37 / iVar3) * lVar28;
                  if (iVar3 == 4 && bVar62) {
                    pauVar48 = (undefined1 (*) [16])
                               ((long)(_func_int ***)pvVar20 + lVar33 + (long)iVar24 * 4);
                    iVar56 = iVar4;
                    do {
                      auVar87 = vfmadd231ps_fma(auVar203._0_16_,*pauVar48,
                                                *(undefined1 (*) [16])*pauVar51);
                      auVar203 = ZEXT1664(auVar87);
                      pauVar51 = (undefined1 (*) [32])(*pauVar51 + 0x10);
                      pauVar48 = (undefined1 (*) [16])(*pauVar48 + lVar54);
                      iVar56 = iVar56 + -1;
                    } while (iVar56 != 0);
                  }
                  else {
                    pauVar48 = (undefined1 (*) [16])
                               ((long)(_func_int ***)pvVar20 +
                               lVar33 + (long)(iVar3 * iVar45 * local_118._0_4_) * 4);
                  }
                  iVar56 = iVar4;
                  if (iVar3 == 1 && bVar62) {
                    do {
                      auVar87 = vinsertps_avx(ZEXT416(*(uint *)*pauVar48),
                                              ZEXT416(*(uint *)(*pauVar48 + lVar61 * 4)),0x10);
                      auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(*pauVar48 +
                                                                       (long)(iVar22 * 2) * 4)),0x20
                                             );
                      auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(*pauVar48 +
                                                                       (long)(iVar22 * 3) * 4)),0x30
                                             );
                      auVar87 = vfmadd231ps_fma(auVar203._0_16_,auVar87,
                                                *(undefined1 (*) [16])*pauVar51);
                      auVar203 = ZEXT1664(auVar87);
                      pauVar51 = (undefined1 (*) [32])(*pauVar51 + 0x10);
                      pauVar48 = (undefined1 (*) [16])(*pauVar48 + lVar26);
                      iVar56 = iVar56 + -1;
                    } while (iVar56 != 0);
                  }
                  auVar87 = auVar203._0_16_;
                  uVar32 = uVar37 + 4;
                  iVar56 = uVar37 + 7;
                  uVar37 = uVar32;
                } while (iVar56 < (int)uVar21);
              }
              uVar29 = (ulong)uVar32;
              auVar101._0_4_ = auVar305._16_4_ + auVar305._0_4_;
              auVar101._4_4_ = auVar305._20_4_ + auVar305._4_4_;
              auVar101._8_4_ = auVar305._24_4_ + auVar305._8_4_;
              auVar101._12_4_ = auVar305._28_4_ + auVar305._12_4_;
              auVar120 = vshufpd_avx(auVar101,auVar101,1);
              auVar102._0_4_ = auVar120._0_4_ + auVar101._0_4_;
              auVar102._4_4_ = auVar120._4_4_ + auVar101._4_4_;
              auVar102._8_4_ = auVar120._8_4_ + auVar101._8_4_;
              auVar102._12_4_ = auVar120._12_4_ + auVar101._12_4_;
              auVar120 = vmovshdup_avx(auVar102);
              auVar202 = vshufpd_avx(auVar87,auVar87,1);
              auVar139._0_4_ = auVar202._0_4_ + auVar87._0_4_;
              auVar139._4_4_ = auVar202._4_4_ + auVar87._4_4_;
              auVar139._8_4_ = auVar202._8_4_ + auVar87._8_4_;
              auVar139._12_4_ = auVar202._12_4_ + auVar87._12_4_;
              auVar87 = vmovshdup_avx(auVar139);
              fVar64 = auVar120._0_4_ + fVar64 + auVar102._0_4_ + auVar139._0_4_ + auVar87._0_4_;
              auVar203 = ZEXT464((uint)fVar64);
              if ((int)(uVar32 | 1) < (int)uVar21) {
                pvVar43 = (void *)((long)local_1b0 + lVar28 * uVar29);
                ppp_Var36 = (_func_int ***)((long)&local_198->_vptr_Allocator + lVar28 * uVar29);
                do {
                  if (iVar4 < 1) {
                    auVar87 = auVar203._0_16_;
                  }
                  else {
                    lVar33 = 0;
                    iVar56 = iVar4;
                    do {
                      auVar87 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar51),auVar203._0_16_,
                                                ZEXT416(*(uint *)((long)ppp_Var36 + lVar33)));
                      auVar87 = vfmadd231ss_fma(auVar87,ZEXT416(*(uint *)(*pauVar51 + 4)),
                                                ZEXT416(*(uint *)((long)pvVar43 + lVar33)));
                      pauVar51 = (undefined1 (*) [32])(*pauVar51 + 8);
                      lVar33 = lVar33 + lVar26;
                      auVar203 = ZEXT1664(auVar87);
                      iVar56 = iVar56 + -1;
                    } while (iVar56 != 0);
                  }
                  auVar206 = ZEXT1664(auVar87);
                  uVar29 = uVar29 + 2;
                  uVar32 = (uint)uVar29;
                  pvVar43 = (void *)((long)pvVar43 + lVar28 * 2);
                  ppp_Var36 = (_func_int ***)((long)ppp_Var36 + lVar28 * 2);
                  auVar203 = ZEXT1664(auVar87);
                } while ((int)(uVar32 | 1) < (int)uVar21);
              }
              else {
                auVar206 = ZEXT464((uint)fVar64);
              }
              auVar87 = auVar206._0_16_;
              if ((int)uVar32 < (int)uVar21) {
                uVar29 = (ulong)uVar32;
                ppp_Var36 = (_func_int ***)((long)&local_198->_vptr_Allocator + lVar28 * uVar29);
                do {
                  ppp_Var44 = ppp_Var36;
                  iVar56 = iVar4;
                  if (0 < iVar4) {
                    do {
                      auVar87 = vfmadd231ss_fma(auVar206._0_16_,ZEXT416(*(uint *)*pauVar51),
                                                ZEXT416(*(uint *)ppp_Var44));
                      auVar206 = ZEXT1664(auVar87);
                      pauVar51 = (undefined1 (*) [32])(*pauVar51 + 4);
                      ppp_Var44 = (_func_int ***)((long)ppp_Var44 + lVar26);
                      iVar56 = iVar56 + -1;
                    } while (iVar56 != 0);
                  }
                  auVar87 = auVar206._0_16_;
                  uVar29 = uVar29 + 1;
                  ppp_Var36 = (_func_int ***)((long)ppp_Var36 + lVar28);
                } while ((int)uVar29 < (int)uVar21);
              }
              fVar65 = auVar87._0_4_;
              fVar64 = fVar65;
              switch((int)local_80) {
              case 1:
                auVar87 = vmaxss_avx(auVar87,ZEXT416(0));
                fVar64 = auVar87._0_4_;
                break;
              case 2:
                auVar87 = vcmpss_avx(ZEXT816(0) << 0x40,auVar87,1);
                auVar141._8_4_ = 0x3f800000;
                auVar141._0_8_ = 0x3f8000003f800000;
                auVar141._12_4_ = 0x3f800000;
                auVar87 = vblendvps_avx(ZEXT416((uint)*pfVar60),auVar141,auVar87);
                fVar64 = auVar87._0_4_ * fVar65;
                break;
              case 3:
                auVar87 = vmaxss_avx(auVar87,ZEXT416((uint)*pfVar60));
                fVar64 = auVar87._0_4_;
                if (pfVar60[1] < auVar87._0_4_) {
                  fVar64 = pfVar60[1];
                }
                break;
              case 4:
                auVar87 = vminss_avx(auVar87,ZEXT416(0x42b0c0a5));
                auVar103._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
                auVar103._8_4_ = auVar87._8_4_ ^ 0x80000000;
                auVar103._12_4_ = auVar87._12_4_ ^ 0x80000000;
                auVar87 = vcmpss_avx(auVar87,ZEXT416(0xc2b0c0a5),1);
                auVar140._8_4_ = 0x42b0c0a5;
                auVar140._0_8_ = 0x42b0c0a542b0c0a5;
                auVar140._12_4_ = 0x42b0c0a5;
                auVar87 = vblendvps_avx(auVar103,auVar140,auVar87);
                fVar64 = expf(auVar87._0_4_);
                fVar64 = 1.0 / (fVar64 + 1.0);
                break;
              case 5:
                fVar64 = expf(fVar65);
                fVar64 = logf(fVar64 + 1.0);
                fVar64 = tanhf(fVar64);
                fVar64 = fVar64 * fVar65;
                break;
              case 6:
                fVar192 = *pfVar60;
                fVar119 = -pfVar60[1] / fVar192;
                fVar64 = 0.0;
                if ((fVar119 <= fVar65) && (fVar64 = fVar65, fVar65 <= fVar119 + 1.0 / fVar192)) {
                  auVar87 = vfmadd213ss_fma(ZEXT416((uint)fVar192),auVar87,ZEXT416((uint)pfVar60[1])
                                           );
                  fVar64 = auVar87._0_4_ * fVar65;
                }
              }
              *pfVar55 = fVar64;
              pfVar55 = pfVar55 + 1;
              lVar33 = local_118._0_8_ + 1;
              iVar24 = iVar24 + iVar45 * iVar3;
              local_1b0 = (void *)((long)local_1b0 + lVar27 * 4);
              local_198 = (Allocator *)((long)&local_198->_vptr_Allocator + lVar27 * 4);
              local_118._0_8_ = lVar33;
            } while (lVar33 != local_60);
          }
          local_1a0 = local_1a0 + 1;
        } while (local_1a0 != local_88);
      }
      iVar45 = 0;
    }
  }
  piVar18 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_d8.data != (Allocator *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar45;
}

Assistant:

int Convolution1D_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}